

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float fVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [12];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  byte bVar50;
  byte bVar51;
  byte bVar52;
  byte bVar53;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  long lVar54;
  byte bVar55;
  byte bVar56;
  ulong uVar57;
  byte bVar58;
  long lVar59;
  uint uVar60;
  bool bVar61;
  undefined1 uVar62;
  undefined1 uVar63;
  ulong uVar64;
  uint uVar65;
  uint uVar133;
  uint uVar134;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  uint uVar136;
  uint uVar137;
  uint uVar138;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  uint uVar135;
  uint uVar139;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar132 [32];
  vint4 bi_2;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar155;
  undefined4 uVar156;
  float fVar171;
  float fVar172;
  vint4 bi_1;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar167 [32];
  undefined1 auVar160 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar178;
  float fVar179;
  vint4 bi;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar217 [32];
  undefined1 auVar210 [16];
  undefined1 auVar218 [32];
  undefined1 auVar216 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  vint4 ai;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [16];
  undefined1 auVar234 [16];
  undefined1 auVar238 [32];
  undefined1 auVar236 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  vint4 ai_1;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [64];
  vint4 ai_2;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  float fVar250;
  undefined1 auVar251 [32];
  undefined1 auVar252 [64];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [64];
  undefined1 auVar256 [28];
  float fVar258;
  undefined1 auVar257 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [64];
  undefined1 auVar264 [16];
  undefined1 auVar265 [64];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_ab4;
  RTCFilterFunctionNArguments local_8b0;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [16];
  Primitive *local_6b0;
  ulong local_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  RTCHitN local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar131 [32];
  undefined1 auVar237 [32];
  
  uVar57 = (ulong)(byte)prim[1];
  lVar54 = uVar57 * 0x25;
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 4 + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 5 + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 6 + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0xf + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0x11 + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0x1a + 6)));
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0x1b + 6)));
  fVar2 = *(float *)(prim + lVar54 + 0x12);
  auVar266._4_4_ = fVar2;
  auVar266._0_4_ = fVar2;
  auVar266._8_4_ = fVar2;
  auVar266._12_4_ = fVar2;
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar71 = vsubps_avx(auVar85,*(undefined1 (*) [16])(prim + lVar54 + 6));
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0x1c + 6)));
  fVar250 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar54 + 0x16)) *
            *(float *)(prim + lVar54 + 0x1a);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar57 * 7 + 6);
  auVar19 = vpmovsxwd_avx(auVar85);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar57 * 0xb + 6);
  auVar141 = vpmovsxwd_avx(auVar84);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar57 * 9 + 6);
  auVar158 = vpmovsxwd_avx(auVar86);
  auVar66 = vpbroadcastd_avx512vl();
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar57 * 0xd + 6);
  auVar67 = vpmovsxwd_avx512vl(auVar79);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar57 * 0x12 + 6);
  auVar68 = vpmovsxwd_avx512vl(auVar3);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar57 * 0x16 + 6);
  auVar69 = vpmovsxwd_avx512vl(auVar70);
  auVar85 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar85 = vinsertps_avx512f(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar268._0_4_ = fVar2 * auVar71._0_4_;
  auVar268._4_4_ = fVar2 * auVar71._4_4_;
  auVar268._8_4_ = fVar2 * auVar71._8_4_;
  auVar268._12_4_ = fVar2 * auVar71._12_4_;
  auVar70 = vmulps_avx512vl(auVar266,auVar85);
  auVar71 = vcvtdq2ps_avx512vl(auVar76);
  auVar72 = vcvtdq2ps_avx512vl(auVar72);
  auVar73 = vcvtdq2ps_avx512vl(auVar73);
  auVar74 = vcvtdq2ps_avx512vl(auVar74);
  auVar75 = vcvtdq2ps_avx512vl(auVar75);
  auVar85 = vcvtdq2ps_avx(auVar77);
  auVar84 = vcvtdq2ps_avx(auVar78);
  auVar86 = vcvtdq2ps_avx(auVar87);
  auVar79 = vcvtdq2ps_avx(auVar80);
  uVar156 = auVar70._0_4_;
  auVar253._4_4_ = uVar156;
  auVar253._0_4_ = uVar156;
  auVar253._8_4_ = uVar156;
  auVar253._12_4_ = uVar156;
  auVar3 = vshufps_avx(auVar70,auVar70,0x55);
  auVar70 = vshufps_avx(auVar70,auVar70,0xaa);
  auVar76 = vmulps_avx512vl(auVar70,auVar73);
  auVar157._0_4_ = auVar70._0_4_ * auVar85._0_4_;
  auVar157._4_4_ = auVar70._4_4_ * auVar85._4_4_;
  auVar157._8_4_ = auVar70._8_4_ * auVar85._8_4_;
  auVar157._12_4_ = auVar70._12_4_ * auVar85._12_4_;
  auVar140._0_4_ = auVar79._0_4_ * auVar70._0_4_;
  auVar140._4_4_ = auVar79._4_4_ * auVar70._4_4_;
  auVar140._8_4_ = auVar79._8_4_ * auVar70._8_4_;
  auVar140._12_4_ = auVar79._12_4_ * auVar70._12_4_;
  auVar70 = vfmadd231ps_avx512vl(auVar76,auVar3,auVar72);
  auVar76 = vfmadd231ps_avx512vl(auVar157,auVar3,auVar75);
  auVar3 = vfmadd231ps_fma(auVar140,auVar86,auVar3);
  auVar77 = vfmadd231ps_avx512vl(auVar70,auVar253,auVar71);
  auVar78 = vfmadd231ps_avx512vl(auVar76,auVar253,auVar74);
  auVar76 = vfmadd231ps_fma(auVar3,auVar84,auVar253);
  auVar264._4_4_ = auVar268._0_4_;
  auVar264._0_4_ = auVar268._0_4_;
  auVar264._8_4_ = auVar268._0_4_;
  auVar264._12_4_ = auVar268._0_4_;
  auVar3 = vshufps_avx(auVar268,auVar268,0x55);
  auVar70 = vshufps_avx(auVar268,auVar268,0xaa);
  auVar73 = vmulps_avx512vl(auVar70,auVar73);
  auVar254._0_4_ = auVar70._0_4_ * auVar85._0_4_;
  auVar254._4_4_ = auVar70._4_4_ * auVar85._4_4_;
  auVar254._8_4_ = auVar70._8_4_ * auVar85._8_4_;
  auVar254._12_4_ = auVar70._12_4_ * auVar85._12_4_;
  auVar203._0_4_ = auVar70._0_4_ * auVar79._0_4_;
  auVar203._4_4_ = auVar70._4_4_ * auVar79._4_4_;
  auVar203._8_4_ = auVar70._8_4_ * auVar79._8_4_;
  auVar203._12_4_ = auVar70._12_4_ * auVar79._12_4_;
  auVar79 = vfmadd231ps_avx512vl(auVar73,auVar3,auVar72);
  auVar70 = vfmadd231ps_avx512vl(auVar254,auVar3,auVar75);
  auVar85 = vfmadd231ps_fma(auVar203,auVar3,auVar86);
  auVar80 = vfmadd231ps_avx512vl(auVar79,auVar264,auVar71);
  auVar71 = vfmadd231ps_avx512vl(auVar70,auVar264,auVar74);
  auVar87 = vfmadd231ps_fma(auVar85,auVar264,auVar84);
  auVar261._8_4_ = 0x7fffffff;
  auVar261._0_8_ = 0x7fffffff7fffffff;
  auVar261._12_4_ = 0x7fffffff;
  auVar85 = vandps_avx(auVar261,auVar77);
  auVar259._8_4_ = 0x219392ef;
  auVar259._0_8_ = 0x219392ef219392ef;
  auVar259._12_4_ = 0x219392ef;
  uVar64 = vcmpps_avx512vl(auVar85,auVar259,1);
  bVar61 = (bool)((byte)uVar64 & 1);
  auVar81._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar77._0_4_;
  bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar77._4_4_;
  bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar77._8_4_;
  bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar77._12_4_;
  auVar85 = vandps_avx(auVar261,auVar78);
  uVar64 = vcmpps_avx512vl(auVar85,auVar259,1);
  bVar61 = (bool)((byte)uVar64 & 1);
  auVar82._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar78._0_4_;
  bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar78._4_4_;
  bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar78._8_4_;
  bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar78._12_4_;
  auVar85 = vandps_avx(auVar261,auVar76);
  uVar64 = vcmpps_avx512vl(auVar85,auVar259,1);
  bVar61 = (bool)((byte)uVar64 & 1);
  auVar83._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar76._0_4_;
  bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar76._4_4_;
  bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar76._8_4_;
  bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar76._12_4_;
  auVar84 = vrcp14ps_avx512vl(auVar81);
  auVar260._8_4_ = 0x3f800000;
  auVar260._0_8_ = 0x3f8000003f800000;
  auVar260._12_4_ = 0x3f800000;
  auVar85 = vfnmadd213ps_fma(auVar81,auVar84,auVar260);
  auVar86 = vfmadd132ps_fma(auVar85,auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar82);
  auVar85 = vfnmadd213ps_fma(auVar82,auVar84,auVar260);
  auVar79 = vfmadd132ps_fma(auVar85,auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar83);
  auVar85 = vfnmadd213ps_fma(auVar83,auVar84,auVar260);
  auVar3 = vfmadd132ps_fma(auVar85,auVar84,auVar84);
  auVar230._4_4_ = fVar250;
  auVar230._0_4_ = fVar250;
  auVar230._8_4_ = fVar250;
  auVar230._12_4_ = fVar250;
  auVar85 = vcvtdq2ps_avx(auVar19);
  auVar84 = vcvtdq2ps_avx(auVar141);
  auVar84 = vsubps_avx(auVar84,auVar85);
  auVar70 = vfmadd213ps_fma(auVar84,auVar230,auVar85);
  auVar85 = vcvtdq2ps_avx(auVar158);
  auVar84 = vcvtdq2ps_avx512vl(auVar67);
  auVar84 = vsubps_avx(auVar84,auVar85);
  auVar78 = vfmadd213ps_fma(auVar84,auVar230,auVar85);
  auVar72 = vcvtdq2ps_avx512vl(auVar68);
  auVar85 = vcvtdq2ps_avx512vl(auVar69);
  auVar84 = vsubps_avx(auVar85,auVar72);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar57 * 0x14 + 6);
  auVar85 = vpmovsxwd_avx(auVar76);
  auVar76 = vfmadd213ps_fma(auVar84,auVar230,auVar72);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar57 * 0x18 + 6);
  auVar84 = vpmovsxwd_avx(auVar72);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar85);
  auVar72 = vfmadd213ps_fma(auVar84,auVar230,auVar85);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar57 * 0x1d + 6);
  auVar85 = vpmovsxwd_avx(auVar73);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar57 * 0x21 + 6);
  auVar84 = vpmovsxwd_avx(auVar74);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar85);
  auVar73 = vfmadd213ps_fma(auVar84,auVar230,auVar85);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar57 * 0x1f + 6);
  auVar85 = vpmovsxwd_avx(auVar75);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar57 * 0x23 + 6);
  auVar84 = vpmovsxwd_avx(auVar77);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar85);
  auVar84 = vfmadd213ps_fma(auVar84,auVar230,auVar85);
  auVar85 = vsubps_avx512vl(auVar70,auVar80);
  auVar68._0_4_ = auVar86._0_4_ * auVar85._0_4_;
  auVar68._4_4_ = auVar86._4_4_ * auVar85._4_4_;
  auVar68._8_4_ = auVar86._8_4_ * auVar85._8_4_;
  auVar68._12_4_ = auVar86._12_4_ * auVar85._12_4_;
  auVar85 = vsubps_avx512vl(auVar78,auVar80);
  auVar67._0_4_ = auVar86._0_4_ * auVar85._0_4_;
  auVar67._4_4_ = auVar86._4_4_ * auVar85._4_4_;
  auVar67._8_4_ = auVar86._8_4_ * auVar85._8_4_;
  auVar67._12_4_ = auVar86._12_4_ * auVar85._12_4_;
  auVar85 = vsubps_avx(auVar76,auVar71);
  auVar69._0_4_ = auVar79._0_4_ * auVar85._0_4_;
  auVar69._4_4_ = auVar79._4_4_ * auVar85._4_4_;
  auVar69._8_4_ = auVar79._8_4_ * auVar85._8_4_;
  auVar69._12_4_ = auVar79._12_4_ * auVar85._12_4_;
  auVar85 = vsubps_avx(auVar72,auVar71);
  auVar158._0_4_ = auVar79._0_4_ * auVar85._0_4_;
  auVar158._4_4_ = auVar79._4_4_ * auVar85._4_4_;
  auVar158._8_4_ = auVar79._8_4_ * auVar85._8_4_;
  auVar158._12_4_ = auVar79._12_4_ * auVar85._12_4_;
  auVar85 = vsubps_avx(auVar73,auVar87);
  auVar71._0_4_ = auVar3._0_4_ * auVar85._0_4_;
  auVar71._4_4_ = auVar3._4_4_ * auVar85._4_4_;
  auVar71._8_4_ = auVar3._8_4_ * auVar85._8_4_;
  auVar71._12_4_ = auVar3._12_4_ * auVar85._12_4_;
  auVar85 = vsubps_avx(auVar84,auVar87);
  auVar141._0_4_ = auVar3._0_4_ * auVar85._0_4_;
  auVar141._4_4_ = auVar3._4_4_ * auVar85._4_4_;
  auVar141._8_4_ = auVar3._8_4_ * auVar85._8_4_;
  auVar141._12_4_ = auVar3._12_4_ * auVar85._12_4_;
  auVar85 = vpminsd_avx(auVar68,auVar67);
  auVar84 = vpminsd_avx(auVar69,auVar158);
  auVar85 = vmaxps_avx(auVar85,auVar84);
  auVar84 = vpminsd_avx(auVar71,auVar141);
  uVar156 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar78._4_4_ = uVar156;
  auVar78._0_4_ = uVar156;
  auVar78._8_4_ = uVar156;
  auVar78._12_4_ = uVar156;
  auVar84 = vmaxps_avx512vl(auVar84,auVar78);
  auVar85 = vmaxps_avx(auVar85,auVar84);
  auVar87._8_4_ = 0x3f7ffffa;
  auVar87._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar87._12_4_ = 0x3f7ffffa;
  local_480 = vmulps_avx512vl(auVar85,auVar87);
  auVar85 = vpmaxsd_avx(auVar68,auVar67);
  auVar84 = vpmaxsd_avx(auVar69,auVar158);
  auVar85 = vminps_avx(auVar85,auVar84);
  auVar84 = vpmaxsd_avx(auVar71,auVar141);
  uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar80._4_4_ = uVar156;
  auVar80._0_4_ = uVar156;
  auVar80._8_4_ = uVar156;
  auVar80._12_4_ = uVar156;
  auVar84 = vminps_avx512vl(auVar84,auVar80);
  auVar85 = vminps_avx(auVar85,auVar84);
  auVar19._8_4_ = 0x3f800003;
  auVar19._0_8_ = 0x3f8000033f800003;
  auVar19._12_4_ = 0x3f800003;
  auVar85 = vmulps_avx512vl(auVar85,auVar19);
  uVar20 = vcmpps_avx512vl(local_480,auVar85,2);
  uVar22 = vpcmpgtd_avx512vl(auVar66,_DAT_01f4ad30);
  local_6a8 = (ulong)((byte)uVar20 & 0xf & (byte)uVar22);
  local_460 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar240 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  local_6b0 = prim;
LAB_0189f884:
  if (local_6a8 == 0) {
LAB_018a21c3:
    return local_6a8 != 0;
  }
  lVar54 = 0;
  for (uVar64 = local_6a8; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
    lVar54 = lVar54 + 1;
  }
  uVar4 = *(uint *)(local_6b0 + 2);
  pGVar5 = (context->scene->geometries).items[uVar4].ptr;
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           (ulong)*(uint *)(local_6b0 + lVar54 * 4 + 6) *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar2 = (pGVar5->time_range).lower;
  fVar2 = pGVar5->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar2) / ((pGVar5->time_range).upper - fVar2));
  auVar85 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
  auVar85 = vminss_avx(auVar85,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar85 = vmaxss_avx(ZEXT816(0) << 0x20,auVar85);
  fVar2 = fVar2 - auVar85._0_4_;
  _Var6 = pGVar5[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar59 = (long)(int)auVar85._0_4_ * 0x38;
  lVar54 = *(long *)(_Var6 + 0x10 + lVar59);
  lVar7 = *(long *)(_Var6 + 0x38 + lVar59);
  lVar8 = *(long *)(_Var6 + 0x48 + lVar59);
  pfVar1 = (float *)(lVar7 + uVar64 * lVar8);
  auVar142._0_4_ = fVar2 * *pfVar1;
  auVar142._4_4_ = fVar2 * pfVar1[1];
  auVar142._8_4_ = fVar2 * pfVar1[2];
  auVar142._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar64 + 1) * lVar8);
  auVar159._0_4_ = fVar2 * *pfVar1;
  auVar159._4_4_ = fVar2 * pfVar1[1];
  auVar159._8_4_ = fVar2 * pfVar1[2];
  auVar159._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar64 + 2) * lVar8);
  auVar180._0_4_ = fVar2 * *pfVar1;
  auVar180._4_4_ = fVar2 * pfVar1[1];
  auVar180._8_4_ = fVar2 * pfVar1[2];
  auVar180._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + lVar8 * (uVar64 + 3));
  auVar204._0_4_ = fVar2 * *pfVar1;
  auVar204._4_4_ = fVar2 * pfVar1[1];
  auVar204._8_4_ = fVar2 * pfVar1[2];
  auVar204._12_4_ = fVar2 * pfVar1[3];
  lVar7 = *(long *)(_Var6 + lVar59);
  fVar2 = 1.0 - fVar2;
  auVar221._4_4_ = fVar2;
  auVar221._0_4_ = fVar2;
  auVar221._8_4_ = fVar2;
  auVar221._12_4_ = fVar2;
  auVar86 = vfmadd231ps_fma(auVar142,auVar221,*(undefined1 (*) [16])(lVar7 + lVar54 * uVar64));
  auVar79 = vfmadd231ps_fma(auVar159,auVar221,*(undefined1 (*) [16])(lVar7 + lVar54 * (uVar64 + 1)))
  ;
  auVar3 = vfmadd231ps_fma(auVar180,auVar221,*(undefined1 (*) [16])(lVar7 + lVar54 * (uVar64 + 2)));
  auVar70 = vfmadd231ps_fma(auVar204,auVar221,*(undefined1 (*) [16])(lVar7 + lVar54 * (uVar64 + 3)))
  ;
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar84 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_520 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  local_540 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar85 = vunpcklps_avx512vl(local_520._0_16_,local_540._0_16_);
  _local_560 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar73 = local_560._0_16_;
  local_7b0 = vinsertps_avx512f(auVar85,auVar73,0x28);
  auVar231._0_4_ = auVar86._0_4_ + auVar79._0_4_ + auVar3._0_4_ + auVar70._0_4_;
  auVar231._4_4_ = auVar86._4_4_ + auVar79._4_4_ + auVar3._4_4_ + auVar70._4_4_;
  auVar231._8_4_ = auVar86._8_4_ + auVar79._8_4_ + auVar3._8_4_ + auVar70._8_4_;
  auVar231._12_4_ = auVar86._12_4_ + auVar79._12_4_ + auVar3._12_4_ + auVar70._12_4_;
  auVar66._8_4_ = 0x3e800000;
  auVar66._0_8_ = 0x3e8000003e800000;
  auVar66._12_4_ = 0x3e800000;
  auVar85 = vmulps_avx512vl(auVar231,auVar66);
  auVar85 = vsubps_avx(auVar85,auVar84);
  auVar85 = vdpps_avx(auVar85,local_7b0,0x7f);
  local_400 = vpbroadcastd_avx512vl();
  local_7c0 = vdpps_avx(local_7b0,local_7b0,0x7f);
  fVar2 = *(float *)(ray + k * 4 + 0x60);
  auVar241._4_12_ = ZEXT812(0) << 0x20;
  auVar241._0_4_ = local_7c0._0_4_;
  auVar72 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar241);
  auVar76 = vfnmadd213ss_fma(auVar72,local_7c0,ZEXT416(0x40000000));
  local_260 = auVar85._0_4_ * auVar72._0_4_ * auVar76._0_4_;
  auVar242._4_4_ = local_260;
  auVar242._0_4_ = local_260;
  auVar242._8_4_ = local_260;
  auVar242._12_4_ = local_260;
  fStack_4d0 = local_260;
  _local_4e0 = auVar242;
  fStack_4cc = local_260;
  fStack_4c8 = local_260;
  fStack_4c4 = local_260;
  auVar85 = vfmadd231ps_fma(auVar84,local_7b0,auVar242);
  auVar85 = vblendps_avx(auVar85,ZEXT816(0) << 0x40,8);
  auVar84 = vsubps_avx(auVar86,auVar85);
  auVar86 = vsubps_avx(auVar3,auVar85);
  auVar79 = vsubps_avx(auVar79,auVar85);
  auVar85 = vsubps_avx(auVar70,auVar85);
  local_7e0 = vbroadcastss_avx512vl(auVar84);
  auVar273 = ZEXT3264(local_7e0);
  auVar93._8_4_ = 1;
  auVar93._0_8_ = 0x100000001;
  auVar93._12_4_ = 1;
  auVar93._16_4_ = 1;
  auVar93._20_4_ = 1;
  auVar93._24_4_ = 1;
  auVar93._28_4_ = 1;
  local_620 = ZEXT1632(auVar84);
  local_800 = vpermps_avx2(auVar93,local_620);
  auVar265 = ZEXT3264(local_800);
  auVar94._8_4_ = 2;
  auVar94._0_8_ = 0x200000002;
  auVar94._12_4_ = 2;
  auVar94._16_4_ = 2;
  auVar94._20_4_ = 2;
  auVar94._24_4_ = 2;
  auVar94._28_4_ = 2;
  local_820 = vpermps_avx2(auVar94,local_620);
  auVar95._8_4_ = 3;
  auVar95._0_8_ = 0x300000003;
  auVar95._12_4_ = 3;
  auVar95._16_4_ = 3;
  auVar95._20_4_ = 3;
  auVar95._24_4_ = 3;
  auVar95._28_4_ = 3;
  local_840 = vpermps_avx2(auVar95,local_620);
  fVar250 = auVar79._0_4_;
  auVar267._4_4_ = fVar250;
  auVar267._0_4_ = fVar250;
  auVar267._8_4_ = fVar250;
  auVar267._12_4_ = fVar250;
  auVar267._16_4_ = fVar250;
  auVar267._20_4_ = fVar250;
  auVar267._24_4_ = fVar250;
  auVar267._28_4_ = fVar250;
  local_660 = ZEXT1632(auVar79);
  local_860 = vpermps_avx2(auVar93,local_660);
  auVar269 = ZEXT3264(local_860);
  local_880 = vpermps_avx512vl(auVar94,local_660);
  auVar88 = vpermps_avx512vl(auVar95,local_660);
  auVar274 = ZEXT3264(auVar88);
  auVar252 = ZEXT3264(local_880);
  auVar88 = vbroadcastss_avx512vl(auVar86);
  auVar270 = ZEXT3264(auVar88);
  local_640 = ZEXT1632(auVar86);
  auVar89 = vpermps_avx512vl(auVar93,local_640);
  auVar271 = ZEXT3264(auVar89);
  auVar90 = vpermps_avx512vl(auVar94,local_640);
  auVar272 = ZEXT3264(auVar90);
  auVar91 = vpermps_avx512vl(auVar95,local_640);
  auVar92 = vbroadcastss_avx512vl(auVar85);
  _local_680 = ZEXT1632(auVar85);
  auVar93 = vpermps_avx512vl(auVar93,_local_680);
  auVar94 = vpermps_avx512vl(auVar94,_local_680);
  auVar95 = vpermps_avx512vl(auVar95,_local_680);
  auVar85 = vmulss_avx512f(auVar73,auVar73);
  auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),local_540,local_540);
  auVar96 = vfmadd231ps_avx512vl(auVar96,local_520,local_520);
  local_220._0_4_ = auVar96._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  local_240 = vandps_avx(auVar240._0_32_,local_220);
  local_6f0 = ZEXT416((uint)local_260);
  local_260 = fVar2 - local_260;
  auVar263 = ZEXT3264(local_840);
  auVar246 = ZEXT3264(local_860);
  auVar255 = ZEXT3264(local_820);
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  uVar60 = 0;
  bVar53 = 0;
  local_ab4 = 1;
  local_420 = vpbroadcastd_avx512vl();
  auVar85 = vsqrtss_avx(local_7c0,local_7c0);
  auVar84 = vsqrtss_avx(local_7c0,local_7c0);
  local_470 = ZEXT816(0x3f80000000000000);
  do {
    auVar86 = vmovshdup_avx(local_470);
    auVar86 = vsubps_avx(auVar86,local_470);
    fVar155 = auVar86._0_4_;
    fVar175 = fVar155 * 0.04761905;
    auVar217._0_4_ = local_470._0_4_;
    auVar217._4_4_ = auVar217._0_4_;
    auVar217._8_4_ = auVar217._0_4_;
    auVar217._12_4_ = auVar217._0_4_;
    auVar217._16_4_ = auVar217._0_4_;
    auVar217._20_4_ = auVar217._0_4_;
    auVar217._24_4_ = auVar217._0_4_;
    auVar217._28_4_ = auVar217._0_4_;
    auVar232._4_4_ = fVar155;
    auVar232._0_4_ = fVar155;
    auVar232._8_4_ = fVar155;
    auVar232._12_4_ = fVar155;
    auVar237._16_4_ = fVar155;
    auVar237._0_16_ = auVar232;
    auVar237._20_4_ = fVar155;
    auVar237._24_4_ = fVar155;
    auVar237._28_4_ = fVar155;
    auVar86 = vfmadd231ps_fma(auVar217,auVar237,_DAT_01f7b040);
    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar96 = vsubps_avx512vl(auVar97,ZEXT1632(auVar86));
    fVar155 = auVar86._0_4_;
    fVar171 = auVar86._4_4_;
    auVar110._4_4_ = fVar250 * fVar171;
    auVar110._0_4_ = fVar250 * fVar155;
    fVar172 = auVar86._8_4_;
    auVar110._8_4_ = fVar250 * fVar172;
    fVar173 = auVar86._12_4_;
    auVar110._12_4_ = fVar250 * fVar173;
    auVar110._16_4_ = fVar250 * 0.0;
    auVar110._20_4_ = fVar250 * 0.0;
    auVar110._24_4_ = fVar250 * 0.0;
    auVar110._28_4_ = DAT_01f7b040._28_4_;
    auVar100._4_4_ = auVar246._4_4_ * fVar171;
    auVar100._0_4_ = auVar246._0_4_ * fVar155;
    auVar100._8_4_ = auVar246._8_4_ * fVar172;
    auVar100._12_4_ = auVar246._12_4_ * fVar173;
    auVar100._16_4_ = auVar246._16_4_ * 0.0;
    auVar100._20_4_ = auVar246._20_4_ * 0.0;
    auVar100._24_4_ = auVar246._24_4_ * 0.0;
    auVar100._28_4_ = auVar217._0_4_;
    auVar111._4_4_ = auVar252._4_4_ * fVar171;
    auVar111._0_4_ = auVar252._0_4_ * fVar155;
    auVar111._8_4_ = auVar252._8_4_ * fVar172;
    auVar111._12_4_ = auVar252._12_4_ * fVar173;
    auVar111._16_4_ = auVar252._16_4_ * 0.0;
    auVar111._20_4_ = auVar252._20_4_ * 0.0;
    auVar111._24_4_ = auVar252._24_4_ * 0.0;
    auVar111._28_4_ = fVar250;
    auVar170 = auVar274._0_32_;
    auVar98 = vmulps_avx512vl(auVar170,ZEXT1632(auVar86));
    auVar99 = vfmadd231ps_avx512vl(auVar110,auVar96,auVar273._0_32_);
    auVar79 = vfmadd231ps_fma(auVar100,auVar96,auVar265._0_32_);
    auVar3 = vfmadd231ps_fma(auVar111,auVar96,auVar255._0_32_);
    auVar70 = vfmadd231ps_fma(auVar98,auVar96,auVar263._0_32_);
    auVar98 = vmulps_avx512vl(auVar270._0_32_,ZEXT1632(auVar86));
    auVar106 = ZEXT1632(auVar86);
    auVar100 = vmulps_avx512vl(auVar271._0_32_,auVar106);
    auVar101 = vmulps_avx512vl(auVar272._0_32_,auVar106);
    auVar102 = vmulps_avx512vl(auVar91,auVar106);
    auVar76 = vfmadd231ps_fma(auVar98,auVar96,auVar267);
    auVar72 = vfmadd231ps_fma(auVar100,auVar96,auVar246._0_32_);
    auVar73 = vfmadd231ps_fma(auVar101,auVar96,auVar252._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar102,auVar96,auVar170);
    auVar100 = vmulps_avx512vl(auVar92,auVar106);
    auVar101 = vmulps_avx512vl(auVar93,auVar106);
    auVar102 = vmulps_avx512vl(auVar94,auVar106);
    auVar103 = vmulps_avx512vl(auVar95,auVar106);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,auVar270._0_32_);
    auVar104 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar271._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar102,auVar96,auVar272._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar96,auVar91);
    auVar240._28_36_ = auVar269._28_36_;
    auVar240._0_28_ =
         ZEXT1628(CONCAT412(fVar173 * auVar76._12_4_,
                            CONCAT48(fVar172 * auVar76._8_4_,
                                     CONCAT44(fVar171 * auVar76._4_4_,fVar155 * auVar76._0_4_))));
    auVar101 = vmulps_avx512vl(auVar106,ZEXT1632(auVar72));
    auVar102 = vmulps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar73));
    auVar106 = vmulps_avx512vl(ZEXT1632(auVar86),auVar98);
    auVar86 = vfmadd231ps_fma(auVar240._0_32_,auVar96,auVar99);
    auVar107 = vfmadd231ps_avx512vl(auVar101,auVar96,ZEXT1632(auVar79));
    auVar108 = vfmadd231ps_avx512vl(auVar102,auVar96,ZEXT1632(auVar3));
    auVar109 = vfmadd231ps_avx512vl(auVar106,auVar96,ZEXT1632(auVar70));
    auVar112._0_4_ = auVar100._0_4_ * fVar155;
    auVar112._4_4_ = auVar100._4_4_ * fVar171;
    auVar112._8_4_ = auVar100._8_4_ * fVar172;
    auVar112._12_4_ = auVar100._12_4_ * fVar173;
    auVar112._16_4_ = auVar100._16_4_ * 0.0;
    auVar112._20_4_ = auVar100._20_4_ * 0.0;
    auVar112._24_4_ = auVar100._24_4_ * 0.0;
    auVar112._28_4_ = 0;
    auVar101._4_4_ = auVar104._4_4_ * fVar171;
    auVar101._0_4_ = auVar104._0_4_ * fVar155;
    auVar101._8_4_ = auVar104._8_4_ * fVar172;
    auVar101._12_4_ = auVar104._12_4_ * fVar173;
    auVar101._16_4_ = auVar104._16_4_ * 0.0;
    auVar101._20_4_ = auVar104._20_4_ * 0.0;
    auVar101._24_4_ = auVar104._24_4_ * 0.0;
    auVar101._28_4_ = auVar100._28_4_;
    auVar102._4_4_ = auVar105._4_4_ * fVar171;
    auVar102._0_4_ = auVar105._0_4_ * fVar155;
    auVar102._8_4_ = auVar105._8_4_ * fVar172;
    auVar102._12_4_ = auVar105._12_4_ * fVar173;
    auVar102._16_4_ = auVar105._16_4_ * 0.0;
    auVar102._20_4_ = auVar105._20_4_ * 0.0;
    auVar102._24_4_ = auVar105._24_4_ * 0.0;
    auVar102._28_4_ = auVar104._28_4_;
    auVar106._4_4_ = auVar103._4_4_ * fVar171;
    auVar106._0_4_ = auVar103._0_4_ * fVar155;
    auVar106._8_4_ = auVar103._8_4_ * fVar172;
    auVar106._12_4_ = auVar103._12_4_ * fVar173;
    auVar106._16_4_ = auVar103._16_4_ * 0.0;
    auVar106._20_4_ = auVar103._20_4_ * 0.0;
    auVar106._24_4_ = auVar103._24_4_ * 0.0;
    auVar106._28_4_ = auVar105._28_4_;
    auVar79 = vfmadd231ps_fma(auVar112,auVar96,ZEXT1632(auVar76));
    auVar3 = vfmadd231ps_fma(auVar101,auVar96,ZEXT1632(auVar72));
    auVar70 = vfmadd231ps_fma(auVar102,auVar96,ZEXT1632(auVar73));
    auVar76 = vfmadd231ps_fma(auVar106,auVar96,auVar98);
    auVar105._28_4_ = auVar99._28_4_;
    auVar105._0_28_ =
         ZEXT1628(CONCAT412(auVar70._12_4_ * fVar173,
                            CONCAT48(auVar70._8_4_ * fVar172,
                                     CONCAT44(auVar70._4_4_ * fVar171,auVar70._0_4_ * fVar155))));
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar173 * auVar79._12_4_,
                                                 CONCAT48(fVar172 * auVar79._8_4_,
                                                          CONCAT44(fVar171 * auVar79._4_4_,
                                                                   fVar155 * auVar79._0_4_)))),
                              auVar96,ZEXT1632(auVar86));
    auVar106 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar3._12_4_ * fVar173,
                                             CONCAT48(auVar3._8_4_ * fVar172,
                                                      CONCAT44(auVar3._4_4_ * fVar171,
                                                               auVar3._0_4_ * fVar155)))),auVar96,
                          auVar107);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar96,auVar108);
    auVar98 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar76._12_4_ * fVar173,
                                            CONCAT48(auVar76._8_4_ * fVar172,
                                                     CONCAT44(auVar76._4_4_ * fVar171,
                                                              auVar76._0_4_ * fVar155)))),auVar109,
                         auVar96);
    auVar96 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar86));
    auVar100 = vsubps_avx512vl(ZEXT1632(auVar3),auVar107);
    auVar101 = vsubps_avx512vl(ZEXT1632(auVar70),auVar108);
    auVar102 = vsubps_avx512vl(ZEXT1632(auVar76),auVar109);
    auVar124._0_4_ = fVar175 * auVar96._0_4_ * 3.0;
    auVar124._4_4_ = fVar175 * auVar96._4_4_ * 3.0;
    auVar124._8_4_ = fVar175 * auVar96._8_4_ * 3.0;
    auVar124._12_4_ = fVar175 * auVar96._12_4_ * 3.0;
    auVar124._16_4_ = fVar175 * auVar96._16_4_ * 3.0;
    auVar124._20_4_ = fVar175 * auVar96._20_4_ * 3.0;
    auVar124._24_4_ = fVar175 * auVar96._24_4_ * 3.0;
    auVar124._28_4_ = 0;
    auVar125._0_4_ = fVar175 * auVar100._0_4_ * 3.0;
    auVar125._4_4_ = fVar175 * auVar100._4_4_ * 3.0;
    auVar125._8_4_ = fVar175 * auVar100._8_4_ * 3.0;
    auVar125._12_4_ = fVar175 * auVar100._12_4_ * 3.0;
    auVar125._16_4_ = fVar175 * auVar100._16_4_ * 3.0;
    auVar125._20_4_ = fVar175 * auVar100._20_4_ * 3.0;
    auVar125._24_4_ = fVar175 * auVar100._24_4_ * 3.0;
    auVar125._28_4_ = 0;
    auVar107._4_4_ = fVar175 * auVar101._4_4_ * 3.0;
    auVar107._0_4_ = fVar175 * auVar101._0_4_ * 3.0;
    auVar107._8_4_ = fVar175 * auVar101._8_4_ * 3.0;
    auVar107._12_4_ = fVar175 * auVar101._12_4_ * 3.0;
    auVar107._16_4_ = fVar175 * auVar101._16_4_ * 3.0;
    auVar107._20_4_ = fVar175 * auVar101._20_4_ * 3.0;
    auVar107._24_4_ = fVar175 * auVar101._24_4_ * 3.0;
    auVar107._28_4_ = auVar103._28_4_;
    fVar155 = auVar102._0_4_ * 3.0 * fVar175;
    fVar171 = auVar102._4_4_ * 3.0 * fVar175;
    auVar108._4_4_ = fVar171;
    auVar108._0_4_ = fVar155;
    fVar172 = auVar102._8_4_ * 3.0 * fVar175;
    auVar108._8_4_ = fVar172;
    fVar173 = auVar102._12_4_ * 3.0 * fVar175;
    auVar108._12_4_ = fVar173;
    fVar174 = auVar102._16_4_ * 3.0 * fVar175;
    auVar108._16_4_ = fVar174;
    fVar176 = auVar102._20_4_ * 3.0 * fVar175;
    auVar108._20_4_ = fVar176;
    fVar177 = auVar102._24_4_ * 3.0 * fVar175;
    auVar108._24_4_ = fVar177;
    auVar108._28_4_ = fVar175;
    auVar86 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
    in_ZMM26 = ZEXT1664(auVar86);
    auVar110 = vpermt2ps_avx512vl(ZEXT1632(auVar72),_DAT_01fb9fc0,ZEXT1632(auVar86));
    auVar111 = vpermt2ps_avx512vl(auVar106,_DAT_01fb9fc0,ZEXT1632(auVar86));
    auVar100 = ZEXT1632(auVar86);
    auVar112 = vpermt2ps_avx512vl(auVar105,_DAT_01fb9fc0,auVar100);
    auVar113._0_4_ = auVar98._0_4_ + fVar155;
    auVar113._4_4_ = auVar98._4_4_ + fVar171;
    auVar113._8_4_ = auVar98._8_4_ + fVar172;
    auVar113._12_4_ = auVar98._12_4_ + fVar173;
    auVar113._16_4_ = auVar98._16_4_ + fVar174;
    auVar113._20_4_ = auVar98._20_4_ + fVar176;
    auVar113._24_4_ = auVar98._24_4_ + fVar177;
    auVar113._28_4_ = auVar98._28_4_ + fVar175;
    auVar96 = vmaxps_avx(auVar98,auVar113);
    auVar99 = vminps_avx512vl(auVar98,auVar113);
    auVar103 = vpermt2ps_avx512vl(auVar98,_DAT_01fb9fc0,auVar100);
    auVar113 = vpermt2ps_avx512vl(auVar124,_DAT_01fb9fc0,auVar100);
    auVar114 = vpermt2ps_avx512vl(auVar125,_DAT_01fb9fc0,auVar100);
    auVar122 = ZEXT1632(auVar86);
    auVar115 = vpermt2ps_avx512vl(auVar107,_DAT_01fb9fc0,auVar122);
    auVar98 = vpermt2ps_avx512vl(auVar108,_DAT_01fb9fc0,auVar122);
    auVar98 = vsubps_avx(auVar103,auVar98);
    auVar100 = vsubps_avx(auVar110,ZEXT1632(auVar72));
    auVar101 = vsubps_avx(auVar111,auVar106);
    auVar102 = vsubps_avx(auVar112,auVar105);
    auVar104 = vmulps_avx512vl(auVar101,auVar107);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar125,auVar102);
    auVar108 = vmulps_avx512vl(auVar102,auVar124);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar107,auVar100);
    auVar109 = vmulps_avx512vl(auVar100,auVar125);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar124,auVar101);
    auVar109 = vmulps_avx512vl(auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar104 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar104);
    auVar108 = vmulps_avx512vl(auVar102,auVar102);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar101,auVar101);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar100,auVar100);
    auVar109 = vrcp14ps_avx512vl(auVar108);
    auVar116 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar97);
    auVar109 = vfmadd132ps_avx512vl(auVar116,auVar109,auVar109);
    auVar104 = vmulps_avx512vl(auVar104,auVar109);
    auVar116 = vmulps_avx512vl(auVar101,auVar115);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar114,auVar102);
    auVar117 = vmulps_avx512vl(auVar102,auVar113);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar115,auVar100);
    auVar118 = vmulps_avx512vl(auVar100,auVar114);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar113,auVar101);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar116);
    auVar109 = vmulps_avx512vl(auVar116,auVar109);
    auVar104 = vmaxps_avx512vl(auVar104,auVar109);
    auVar104 = vsqrtps_avx512vl(auVar104);
    auVar109 = vmaxps_avx512vl(auVar98,auVar103);
    auVar96 = vmaxps_avx512vl(auVar96,auVar109);
    auVar116 = vaddps_avx512vl(auVar104,auVar96);
    auVar96 = vminps_avx(auVar98,auVar103);
    auVar96 = vminps_avx512vl(auVar99,auVar96);
    auVar99 = vsubps_avx512vl(auVar96,auVar104);
    auVar96._8_4_ = 0x3f800002;
    auVar96._0_8_ = 0x3f8000023f800002;
    auVar96._12_4_ = 0x3f800002;
    auVar96._16_4_ = 0x3f800002;
    auVar96._20_4_ = 0x3f800002;
    auVar96._24_4_ = 0x3f800002;
    auVar96._28_4_ = 0x3f800002;
    auVar96 = vmulps_avx512vl(auVar116,auVar96);
    auVar98._8_4_ = 0x3f7ffffc;
    auVar98._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar98._12_4_ = 0x3f7ffffc;
    auVar98._16_4_ = 0x3f7ffffc;
    auVar98._20_4_ = 0x3f7ffffc;
    auVar98._24_4_ = 0x3f7ffffc;
    auVar98._28_4_ = 0x3f7ffffc;
    auVar98 = vmulps_avx512vl(auVar99,auVar98);
    auVar96 = vmulps_avx512vl(auVar96,auVar96);
    auVar104 = vrsqrt14ps_avx512vl(auVar108);
    auVar99._8_4_ = 0xbf000000;
    auVar99._0_8_ = 0xbf000000bf000000;
    auVar99._12_4_ = 0xbf000000;
    auVar99._16_4_ = 0xbf000000;
    auVar99._20_4_ = 0xbf000000;
    auVar99._24_4_ = 0xbf000000;
    auVar99._28_4_ = 0xbf000000;
    auVar99 = vmulps_avx512vl(auVar108,auVar99);
    fVar155 = auVar104._0_4_;
    fVar171 = auVar104._4_4_;
    fVar172 = auVar104._8_4_;
    fVar173 = auVar104._12_4_;
    fVar175 = auVar104._16_4_;
    fVar174 = auVar104._20_4_;
    fVar176 = auVar104._24_4_;
    auVar109._4_4_ = fVar171 * fVar171 * fVar171 * auVar99._4_4_;
    auVar109._0_4_ = fVar155 * fVar155 * fVar155 * auVar99._0_4_;
    auVar109._8_4_ = fVar172 * fVar172 * fVar172 * auVar99._8_4_;
    auVar109._12_4_ = fVar173 * fVar173 * fVar173 * auVar99._12_4_;
    auVar109._16_4_ = fVar175 * fVar175 * fVar175 * auVar99._16_4_;
    auVar109._20_4_ = fVar174 * fVar174 * fVar174 * auVar99._20_4_;
    auVar109._24_4_ = fVar176 * fVar176 * fVar176 * auVar99._24_4_;
    auVar109._28_4_ = auVar116._28_4_;
    auVar103._8_4_ = 0x3fc00000;
    auVar103._0_8_ = 0x3fc000003fc00000;
    auVar103._12_4_ = 0x3fc00000;
    auVar103._16_4_ = 0x3fc00000;
    auVar103._20_4_ = 0x3fc00000;
    auVar103._24_4_ = 0x3fc00000;
    auVar103._28_4_ = 0x3fc00000;
    auVar99 = vfmadd231ps_avx512vl(auVar109,auVar104,auVar103);
    auVar269 = ZEXT3264(auVar99);
    auVar103 = vmulps_avx512vl(auVar100,auVar99);
    auVar104 = vmulps_avx512vl(auVar101,auVar99);
    auVar108 = vmulps_avx512vl(auVar102,auVar99);
    auVar226 = ZEXT1632(auVar72);
    auVar109 = vsubps_avx512vl(auVar122,auVar226);
    auVar116 = vsubps_avx512vl(auVar122,auVar106);
    auVar117 = vsubps_avx512vl(auVar122,auVar105);
    auVar118 = vmulps_avx512vl(_local_560,auVar117);
    auVar118 = vfmadd231ps_avx512vl(auVar118,local_540,auVar116);
    auVar118 = vfmadd231ps_avx512vl(auVar118,local_520,auVar109);
    auVar119 = vmulps_avx512vl(auVar117,auVar117);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,auVar116);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar109,auVar109);
    auVar120 = vmulps_avx512vl(_local_560,auVar108);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar104,local_540);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar103,local_520);
    auVar108 = vmulps_avx512vl(auVar117,auVar108);
    auVar104 = vfmadd231ps_avx512vl(auVar108,auVar116,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar109,auVar103);
    auVar108 = vmulps_avx512vl(auVar120,auVar120);
    auVar121 = vsubps_avx512vl(local_220,auVar108);
    auVar104 = vmulps_avx512vl(auVar120,auVar103);
    auVar104 = vsubps_avx512vl(auVar118,auVar104);
    auVar118 = vaddps_avx512vl(auVar104,auVar104);
    auVar104 = vmulps_avx512vl(auVar103,auVar103);
    local_740 = vsubps_avx512vl(auVar119,auVar104);
    auVar96 = vsubps_avx512vl(local_740,auVar96);
    local_580 = vmulps_avx512vl(auVar118,auVar118);
    auVar104._8_4_ = 0x40800000;
    auVar104._0_8_ = 0x4080000040800000;
    auVar104._12_4_ = 0x40800000;
    auVar104._16_4_ = 0x40800000;
    auVar104._20_4_ = 0x40800000;
    auVar104._24_4_ = 0x40800000;
    auVar104._28_4_ = 0x40800000;
    _local_5a0 = vmulps_avx512vl(auVar121,auVar104);
    auVar104 = vmulps_avx512vl(_local_5a0,auVar96);
    auVar104 = vsubps_avx512vl(local_580,auVar104);
    uVar64 = vcmpps_avx512vl(auVar104,auVar122,5);
    bVar50 = (byte)uVar64;
    if (bVar50 == 0) {
LAB_018a05eb:
      auVar273 = ZEXT3264(local_7e0);
      auVar265 = ZEXT3264(local_800);
      auVar263 = ZEXT3264(local_840);
      auVar255 = ZEXT3264(local_820);
      auVar252 = ZEXT3264(local_880);
      auVar246 = ZEXT3264(local_860);
      auVar240 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
      auVar96 = vmovdqa64_avx512vl(auVar88);
      auVar270 = ZEXT3264(auVar96);
      auVar96 = vmovdqa64_avx512vl(auVar89);
      auVar271 = ZEXT3264(auVar96);
      auVar96 = vmovdqa64_avx512vl(auVar90);
      auVar272 = ZEXT3264(auVar96);
    }
    else {
      auVar104 = vsqrtps_avx512vl(auVar104);
      local_6a0 = vaddps_avx512vl(auVar121,auVar121);
      local_5c0 = vrcp14ps_avx512vl(local_6a0);
      auVar97 = vfnmadd213ps_avx512vl(local_5c0,local_6a0,auVar97);
      auVar119 = vfmadd132ps_avx512vl(auVar97,local_5c0,local_5c0);
      auVar97._8_4_ = 0x80000000;
      auVar97._0_8_ = 0x8000000080000000;
      auVar97._12_4_ = 0x80000000;
      auVar97._16_4_ = 0x80000000;
      auVar97._20_4_ = 0x80000000;
      auVar97._24_4_ = 0x80000000;
      auVar97._28_4_ = 0x80000000;
      local_5e0 = vxorps_avx512vl(auVar118,auVar97);
      auVar97 = vsubps_avx512vl(local_5e0,auVar104);
      local_7a0 = vmulps_avx512vl(auVar97,auVar119);
      auVar104 = vsubps_avx512vl(auVar104,auVar118);
      local_600 = vmulps_avx512vl(auVar104,auVar119);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar97 = vblendmps_avx512vl(auVar104,local_7a0);
      auVar122._0_4_ =
           (uint)(bVar50 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar50 & 1) * auVar104._0_4_;
      bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar61 * auVar97._4_4_ | (uint)!bVar61 * auVar104._4_4_;
      bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar61 * auVar97._8_4_ | (uint)!bVar61 * auVar104._8_4_;
      bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar61 * auVar97._12_4_ | (uint)!bVar61 * auVar104._12_4_;
      bVar61 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar61 * auVar97._16_4_ | (uint)!bVar61 * auVar104._16_4_;
      bVar61 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar61 * auVar97._20_4_ | (uint)!bVar61 * auVar104._20_4_;
      bVar61 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar61 * auVar97._24_4_ | (uint)!bVar61 * auVar104._24_4_;
      bVar61 = SUB81(uVar64 >> 7,0);
      auVar122._28_4_ = (uint)bVar61 * auVar97._28_4_ | (uint)!bVar61 * auVar104._28_4_;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar97 = vblendmps_avx512vl(auVar104,local_600);
      auVar123._0_4_ =
           (uint)(bVar50 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar50 & 1) * auVar104._0_4_;
      bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar61 * auVar97._4_4_ | (uint)!bVar61 * auVar104._4_4_;
      bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar61 * auVar97._8_4_ | (uint)!bVar61 * auVar104._8_4_;
      bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar61 * auVar97._12_4_ | (uint)!bVar61 * auVar104._12_4_;
      bVar61 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar61 * auVar97._16_4_ | (uint)!bVar61 * auVar104._16_4_;
      bVar61 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar61 * auVar97._20_4_ | (uint)!bVar61 * auVar104._20_4_;
      bVar61 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar61 * auVar97._24_4_ | (uint)!bVar61 * auVar104._24_4_;
      bVar61 = SUB81(uVar64 >> 7,0);
      auVar123._28_4_ = (uint)bVar61 * auVar97._28_4_ | (uint)!bVar61 * auVar104._28_4_;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar108,auVar104);
      local_760 = vmaxps_avx512vl(local_240,auVar104);
      auVar119._8_4_ = 0x36000000;
      auVar119._0_8_ = 0x3600000036000000;
      auVar119._12_4_ = 0x36000000;
      auVar119._16_4_ = 0x36000000;
      auVar119._20_4_ = 0x36000000;
      auVar119._24_4_ = 0x36000000;
      auVar119._28_4_ = 0x36000000;
      local_780 = vmulps_avx512vl(local_760,auVar119);
      vandps_avx512vl(auVar121,auVar104);
      in_ZMM26 = ZEXT3264(local_780);
      uVar57 = vcmpps_avx512vl(local_780,local_780,1);
      uVar64 = uVar64 & uVar57;
      bVar58 = (byte)uVar64;
      if (bVar58 != 0) {
        uVar57 = vcmpps_avx512vl(auVar96,_DAT_01f7b000,2);
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar108 = vblendmps_avx512vl(auVar96,auVar104);
        bVar55 = (byte)uVar57;
        uVar65 = (uint)(bVar55 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar55 & 1) * local_780._0_4_;
        bVar61 = (bool)((byte)(uVar57 >> 1) & 1);
        uVar133 = (uint)bVar61 * auVar108._4_4_ | (uint)!bVar61 * local_780._4_4_;
        bVar61 = (bool)((byte)(uVar57 >> 2) & 1);
        uVar134 = (uint)bVar61 * auVar108._8_4_ | (uint)!bVar61 * local_780._8_4_;
        bVar61 = (bool)((byte)(uVar57 >> 3) & 1);
        uVar135 = (uint)bVar61 * auVar108._12_4_ | (uint)!bVar61 * local_780._12_4_;
        bVar61 = (bool)((byte)(uVar57 >> 4) & 1);
        uVar136 = (uint)bVar61 * auVar108._16_4_ | (uint)!bVar61 * local_780._16_4_;
        bVar61 = (bool)((byte)(uVar57 >> 5) & 1);
        uVar137 = (uint)bVar61 * auVar108._20_4_ | (uint)!bVar61 * local_780._20_4_;
        bVar61 = (bool)((byte)(uVar57 >> 6) & 1);
        uVar138 = (uint)bVar61 * auVar108._24_4_ | (uint)!bVar61 * local_780._24_4_;
        bVar61 = SUB81(uVar57 >> 7,0);
        uVar139 = (uint)bVar61 * auVar108._28_4_ | (uint)!bVar61 * local_780._28_4_;
        auVar122._0_4_ = (bVar58 & 1) * uVar65 | !(bool)(bVar58 & 1) * auVar122._0_4_;
        bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar122._4_4_ = bVar61 * uVar133 | !bVar61 * auVar122._4_4_;
        bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar122._8_4_ = bVar61 * uVar134 | !bVar61 * auVar122._8_4_;
        bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar122._12_4_ = bVar61 * uVar135 | !bVar61 * auVar122._12_4_;
        bVar61 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar122._16_4_ = bVar61 * uVar136 | !bVar61 * auVar122._16_4_;
        bVar61 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar122._20_4_ = bVar61 * uVar137 | !bVar61 * auVar122._20_4_;
        bVar61 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar122._24_4_ = bVar61 * uVar138 | !bVar61 * auVar122._24_4_;
        bVar61 = SUB81(uVar64 >> 7,0);
        auVar122._28_4_ = bVar61 * uVar139 | !bVar61 * auVar122._28_4_;
        auVar96 = vblendmps_avx512vl(auVar104,auVar96);
        bVar61 = (bool)((byte)(uVar57 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar57 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar57 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar57 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar57 >> 6) & 1);
        bVar16 = SUB81(uVar57 >> 7,0);
        auVar123._0_4_ =
             (uint)(bVar58 & 1) *
             ((uint)(bVar55 & 1) * auVar96._0_4_ | !(bool)(bVar55 & 1) * uVar65) |
             !(bool)(bVar58 & 1) * auVar123._0_4_;
        bVar10 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar123._4_4_ =
             (uint)bVar10 * ((uint)bVar61 * auVar96._4_4_ | !bVar61 * uVar133) |
             !bVar10 * auVar123._4_4_;
        bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar123._8_4_ =
             (uint)bVar61 * ((uint)bVar11 * auVar96._8_4_ | !bVar11 * uVar134) |
             !bVar61 * auVar123._8_4_;
        bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar123._12_4_ =
             (uint)bVar61 * ((uint)bVar12 * auVar96._12_4_ | !bVar12 * uVar135) |
             !bVar61 * auVar123._12_4_;
        bVar61 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar123._16_4_ =
             (uint)bVar61 * ((uint)bVar13 * auVar96._16_4_ | !bVar13 * uVar136) |
             !bVar61 * auVar123._16_4_;
        bVar61 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar123._20_4_ =
             (uint)bVar61 * ((uint)bVar14 * auVar96._20_4_ | !bVar14 * uVar137) |
             !bVar61 * auVar123._20_4_;
        bVar61 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar123._24_4_ =
             (uint)bVar61 * ((uint)bVar15 * auVar96._24_4_ | !bVar15 * uVar138) |
             !bVar61 * auVar123._24_4_;
        bVar61 = SUB81(uVar64 >> 7,0);
        auVar123._28_4_ =
             (uint)bVar61 * ((uint)bVar16 * auVar96._28_4_ | !bVar16 * uVar139) |
             !bVar61 * auVar123._28_4_;
        bVar50 = (~bVar58 | bVar55) & bVar50;
      }
      if ((bVar50 & 0x7f) == 0) goto LAB_018a05eb;
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM26 = ZEXT3264(auVar96);
      auVar104 = vxorps_avx512vl(auVar115,auVar96);
      auVar108 = vxorps_avx512vl(auVar113,auVar96);
      auVar240 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
      auVar97 = vxorps_avx512vl(auVar114,auVar96);
      auVar86 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                               ZEXT416((uint)local_6f0._0_4_));
      auVar113 = vbroadcastss_avx512vl(auVar86);
      auVar113 = vminps_avx512vl(auVar113,auVar123);
      auVar121._4_4_ = fStack_25c;
      auVar121._0_4_ = local_260;
      auVar121._8_4_ = fStack_258;
      auVar121._12_4_ = fStack_254;
      auVar121._16_4_ = fStack_250;
      auVar121._20_4_ = fStack_24c;
      auVar121._24_4_ = fStack_248;
      auVar121._28_4_ = fStack_244;
      auVar115 = vmaxps_avx512vl(auVar121,auVar122);
      auVar114 = vmulps_avx512vl(auVar117,auVar107);
      auVar114 = vfmadd213ps_avx512vl(auVar116,auVar125,auVar114);
      auVar86 = vfmadd213ps_fma(auVar109,auVar124,auVar114);
      auVar107 = vmulps_avx512vl(_local_560,auVar107);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_540,auVar125);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_520,auVar124);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar107,auVar109);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar20 = vcmpps_avx512vl(auVar109,auVar116,1);
      auVar117 = vxorps_avx512vl(ZEXT1632(auVar86),auVar96);
      auVar119 = vrcp14ps_avx512vl(auVar107);
      auVar121 = vxorps_avx512vl(auVar107,auVar96);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar114 = vfnmadd213ps_avx512vl(auVar119,auVar107,auVar124);
      auVar86 = vfmadd132ps_fma(auVar114,auVar119,auVar119);
      fVar155 = auVar86._0_4_ * auVar117._0_4_;
      fVar171 = auVar86._4_4_ * auVar117._4_4_;
      auVar114._4_4_ = fVar171;
      auVar114._0_4_ = fVar155;
      fVar172 = auVar86._8_4_ * auVar117._8_4_;
      auVar114._8_4_ = fVar172;
      fVar173 = auVar86._12_4_ * auVar117._12_4_;
      auVar114._12_4_ = fVar173;
      fVar175 = auVar117._16_4_ * 0.0;
      auVar114._16_4_ = fVar175;
      fVar174 = auVar117._20_4_ * 0.0;
      auVar114._20_4_ = fVar174;
      fVar176 = auVar117._24_4_ * 0.0;
      auVar114._24_4_ = fVar176;
      auVar114._28_4_ = auVar117._28_4_;
      uVar22 = vcmpps_avx512vl(auVar107,auVar121,1);
      bVar58 = (byte)uVar20 | (byte)uVar22;
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar114 = vblendmps_avx512vl(auVar114,auVar125);
      auVar126._0_4_ =
           (uint)(bVar58 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar119._0_4_;
      bVar61 = (bool)(bVar58 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar61 * auVar114._4_4_ | (uint)!bVar61 * auVar119._4_4_;
      bVar61 = (bool)(bVar58 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar61 * auVar114._8_4_ | (uint)!bVar61 * auVar119._8_4_;
      bVar61 = (bool)(bVar58 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar61 * auVar114._12_4_ | (uint)!bVar61 * auVar119._12_4_;
      bVar61 = (bool)(bVar58 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar61 * auVar114._16_4_ | (uint)!bVar61 * auVar119._16_4_;
      bVar61 = (bool)(bVar58 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar61 * auVar114._20_4_ | (uint)!bVar61 * auVar119._20_4_;
      bVar61 = (bool)(bVar58 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar61 * auVar114._24_4_ | (uint)!bVar61 * auVar119._24_4_;
      auVar126._28_4_ =
           (uint)(bVar58 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar58 >> 7) * auVar119._28_4_;
      auVar114 = vmaxps_avx512vl(auVar115,auVar126);
      uVar22 = vcmpps_avx512vl(auVar107,auVar121,6);
      bVar58 = (byte)uVar20 | (byte)uVar22;
      auVar127._0_4_ = (uint)(bVar58 & 1) * 0x7f800000 | (uint)!(bool)(bVar58 & 1) * (int)fVar155;
      bVar61 = (bool)(bVar58 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar171;
      bVar61 = (bool)(bVar58 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar172;
      bVar61 = (bool)(bVar58 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar173;
      bVar61 = (bool)(bVar58 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar175;
      bVar61 = (bool)(bVar58 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar174;
      bVar61 = (bool)(bVar58 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar176;
      auVar127._28_4_ =
           (uint)(bVar58 >> 7) * 0x7f800000 | (uint)!(bool)(bVar58 >> 7) * auVar117._28_4_;
      auVar107 = vminps_avx512vl(auVar113,auVar127);
      auVar86 = vxorps_avx512vl(auVar115._0_16_,auVar115._0_16_);
      auVar110 = vsubps_avx512vl(ZEXT1632(auVar86),auVar110);
      auVar111 = vsubps_avx512vl(ZEXT1632(auVar86),auVar111);
      auVar113 = ZEXT1632(auVar86);
      auVar112 = vsubps_avx512vl(auVar113,auVar112);
      auVar112 = vmulps_avx512vl(auVar112,auVar104);
      auVar111 = vfmadd231ps_avx512vl(auVar112,auVar97,auVar111);
      auVar110 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar110);
      auVar104 = vmulps_avx512vl(_local_560,auVar104);
      auVar104 = vfmadd231ps_avx512vl(auVar104,local_540,auVar97);
      auVar104 = vfmadd231ps_avx512vl(auVar104,local_520,auVar108);
      vandps_avx512vl(auVar104,auVar109);
      uVar20 = vcmpps_avx512vl(auVar104,auVar116,1);
      auVar108 = vxorps_avx512vl(auVar110,auVar96);
      auVar109 = vrcp14ps_avx512vl(auVar104);
      auVar96 = vxorps_avx512vl(auVar104,auVar96);
      auVar110 = vfnmadd213ps_avx512vl(auVar109,auVar104,auVar124);
      auVar86 = vfmadd132ps_fma(auVar110,auVar109,auVar109);
      fVar155 = auVar86._0_4_ * auVar108._0_4_;
      fVar171 = auVar86._4_4_ * auVar108._4_4_;
      auVar115._4_4_ = fVar171;
      auVar115._0_4_ = fVar155;
      fVar172 = auVar86._8_4_ * auVar108._8_4_;
      auVar115._8_4_ = fVar172;
      fVar173 = auVar86._12_4_ * auVar108._12_4_;
      auVar115._12_4_ = fVar173;
      fVar175 = auVar108._16_4_ * 0.0;
      auVar115._16_4_ = fVar175;
      fVar174 = auVar108._20_4_ * 0.0;
      auVar115._20_4_ = fVar174;
      fVar176 = auVar108._24_4_ * 0.0;
      auVar115._24_4_ = fVar176;
      auVar115._28_4_ = auVar108._28_4_;
      uVar22 = vcmpps_avx512vl(auVar104,auVar96,1);
      bVar58 = (byte)uVar20 | (byte)uVar22;
      auVar110 = vblendmps_avx512vl(auVar115,auVar125);
      auVar116._0_4_ =
           (uint)(bVar58 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar109._0_4_;
      bVar61 = (bool)(bVar58 >> 1 & 1);
      auVar116._4_4_ = (uint)bVar61 * auVar110._4_4_ | (uint)!bVar61 * auVar109._4_4_;
      bVar61 = (bool)(bVar58 >> 2 & 1);
      auVar116._8_4_ = (uint)bVar61 * auVar110._8_4_ | (uint)!bVar61 * auVar109._8_4_;
      bVar61 = (bool)(bVar58 >> 3 & 1);
      auVar116._12_4_ = (uint)bVar61 * auVar110._12_4_ | (uint)!bVar61 * auVar109._12_4_;
      bVar61 = (bool)(bVar58 >> 4 & 1);
      auVar116._16_4_ = (uint)bVar61 * auVar110._16_4_ | (uint)!bVar61 * auVar109._16_4_;
      bVar61 = (bool)(bVar58 >> 5 & 1);
      auVar116._20_4_ = (uint)bVar61 * auVar110._20_4_ | (uint)!bVar61 * auVar109._20_4_;
      bVar61 = (bool)(bVar58 >> 6 & 1);
      auVar116._24_4_ = (uint)bVar61 * auVar110._24_4_ | (uint)!bVar61 * auVar109._24_4_;
      auVar116._28_4_ =
           (uint)(bVar58 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar58 >> 7) * auVar109._28_4_;
      local_500 = vmaxps_avx(auVar114,auVar116);
      uVar22 = vcmpps_avx512vl(auVar104,auVar96,6);
      bVar58 = (byte)uVar20 | (byte)uVar22;
      auVar117._0_4_ = (uint)(bVar58 & 1) * 0x7f800000 | (uint)!(bool)(bVar58 & 1) * (int)fVar155;
      bVar61 = (bool)(bVar58 >> 1 & 1);
      auVar117._4_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar171;
      bVar61 = (bool)(bVar58 >> 2 & 1);
      auVar117._8_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar172;
      bVar61 = (bool)(bVar58 >> 3 & 1);
      auVar117._12_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar173;
      bVar61 = (bool)(bVar58 >> 4 & 1);
      auVar117._16_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar175;
      bVar61 = (bool)(bVar58 >> 5 & 1);
      auVar117._20_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar174;
      bVar61 = (bool)(bVar58 >> 6 & 1);
      auVar117._24_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar176;
      auVar117._28_4_ =
           (uint)(bVar58 >> 7) * 0x7f800000 | (uint)!(bool)(bVar58 >> 7) * auVar108._28_4_;
      local_2a0 = vminps_avx(auVar107,auVar117);
      uVar20 = vcmpps_avx512vl(local_500,local_2a0,2);
      bVar50 = bVar50 & 0x7f & (byte)uVar20;
      if (bVar50 == 0) {
        auVar274 = ZEXT3264(auVar170);
        goto LAB_018a05eb;
      }
      auVar98 = vmaxps_avx512vl(auVar113,auVar98);
      auVar96 = vfmadd213ps_avx512vl(local_7a0,auVar120,auVar103);
      fVar155 = auVar99._0_4_;
      fVar171 = auVar99._4_4_;
      auVar38._4_4_ = fVar171 * auVar96._4_4_;
      auVar38._0_4_ = fVar155 * auVar96._0_4_;
      fVar172 = auVar99._8_4_;
      auVar38._8_4_ = fVar172 * auVar96._8_4_;
      fVar173 = auVar99._12_4_;
      auVar38._12_4_ = fVar173 * auVar96._12_4_;
      fVar175 = auVar99._16_4_;
      auVar38._16_4_ = fVar175 * auVar96._16_4_;
      fVar174 = auVar99._20_4_;
      auVar38._20_4_ = fVar174 * auVar96._20_4_;
      fVar176 = auVar99._24_4_;
      auVar38._24_4_ = fVar176 * auVar96._24_4_;
      auVar38._28_4_ = auVar96._28_4_;
      auVar96 = vfmadd213ps_avx512vl(local_600,auVar120,auVar103);
      auVar39._4_4_ = fVar171 * auVar96._4_4_;
      auVar39._0_4_ = fVar155 * auVar96._0_4_;
      auVar39._8_4_ = fVar172 * auVar96._8_4_;
      auVar39._12_4_ = fVar173 * auVar96._12_4_;
      auVar39._16_4_ = fVar175 * auVar96._16_4_;
      auVar39._20_4_ = fVar174 * auVar96._20_4_;
      auVar39._24_4_ = fVar176 * auVar96._24_4_;
      auVar39._28_4_ = auVar96._28_4_;
      auVar96 = vminps_avx512vl(auVar38,auVar124);
      auVar47 = ZEXT812(0);
      auVar104 = ZEXT1232(auVar47) << 0x20;
      auVar96 = vmaxps_avx(auVar96,ZEXT1232(auVar47) << 0x20);
      auVar107 = vminps_avx512vl(auVar39,auVar124);
      auVar40._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
      auVar40._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
      auVar40._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
      auVar40._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
      auVar40._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
      auVar40._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
      auVar40._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
      auVar40._28_4_ = auVar96._28_4_ + 7.0;
      local_1e0 = vfmadd213ps_avx512vl(auVar40,auVar237,auVar217);
      auVar96 = vmaxps_avx(auVar107,ZEXT1232(auVar47) << 0x20);
      auVar41._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
      auVar41._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
      auVar41._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
      auVar41._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
      auVar41._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
      auVar41._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
      auVar41._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
      auVar41._28_4_ = auVar96._28_4_ + 7.0;
      local_200 = vfmadd213ps_avx512vl(auVar41,auVar237,auVar217);
      auVar42._4_4_ = auVar98._4_4_ * auVar98._4_4_;
      auVar42._0_4_ = auVar98._0_4_ * auVar98._0_4_;
      auVar42._8_4_ = auVar98._8_4_ * auVar98._8_4_;
      auVar42._12_4_ = auVar98._12_4_ * auVar98._12_4_;
      auVar42._16_4_ = auVar98._16_4_ * auVar98._16_4_;
      auVar42._20_4_ = auVar98._20_4_ * auVar98._20_4_;
      auVar42._24_4_ = auVar98._24_4_ * auVar98._24_4_;
      auVar42._28_4_ = auVar98._28_4_;
      auVar96 = vsubps_avx(local_740,auVar42);
      auVar43._4_4_ = auVar96._4_4_ * (float)local_5a0._4_4_;
      auVar43._0_4_ = auVar96._0_4_ * (float)local_5a0._0_4_;
      auVar43._8_4_ = auVar96._8_4_ * fStack_598;
      auVar43._12_4_ = auVar96._12_4_ * fStack_594;
      auVar43._16_4_ = auVar96._16_4_ * fStack_590;
      auVar43._20_4_ = auVar96._20_4_ * fStack_58c;
      auVar43._24_4_ = auVar96._24_4_ * fStack_588;
      auVar43._28_4_ = auVar98._28_4_;
      auVar98 = vsubps_avx(local_580,auVar43);
      uVar20 = vcmpps_avx512vl(auVar98,ZEXT1232(auVar47) << 0x20,5);
      bVar58 = (byte)uVar20;
      auVar274 = ZEXT3264(auVar170);
      if (bVar58 == 0) {
        bVar58 = 0;
        auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar246 = ZEXT864(0) << 0x20;
        auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar107 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar256 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar118._8_4_ = 0x7f800000;
        auVar118._0_8_ = 0x7f8000007f800000;
        auVar118._12_4_ = 0x7f800000;
        auVar118._16_4_ = 0x7f800000;
        auVar118._20_4_ = 0x7f800000;
        auVar118._24_4_ = 0x7f800000;
        auVar118._28_4_ = 0x7f800000;
        auVar120._8_4_ = 0xff800000;
        auVar120._0_8_ = 0xff800000ff800000;
        auVar120._12_4_ = 0xff800000;
        auVar120._16_4_ = 0xff800000;
        auVar120._20_4_ = 0xff800000;
        auVar120._24_4_ = 0xff800000;
        auVar120._28_4_ = 0xff800000;
      }
      else {
        auVar79 = vxorps_avx512vl(auVar232,auVar232);
        uVar64 = vcmpps_avx512vl(auVar98,auVar113,5);
        auVar98 = vsqrtps_avx(auVar98);
        auVar104 = vfnmadd213ps_avx512vl(local_6a0,local_5c0,auVar124);
        auVar86 = vfmadd132ps_fma(auVar104,local_5c0,local_5c0);
        auVar104 = vsubps_avx(local_5e0,auVar98);
        auVar44._4_4_ = auVar86._4_4_ * auVar104._4_4_;
        auVar44._0_4_ = auVar86._0_4_ * auVar104._0_4_;
        auVar44._8_4_ = auVar86._8_4_ * auVar104._8_4_;
        auVar44._12_4_ = auVar86._12_4_ * auVar104._12_4_;
        auVar44._16_4_ = auVar104._16_4_ * 0.0;
        auVar44._20_4_ = auVar104._20_4_ * 0.0;
        auVar44._24_4_ = auVar104._24_4_ * 0.0;
        auVar44._28_4_ = 0x3e000000;
        auVar98 = vsubps_avx512vl(auVar98,auVar118);
        auVar45._4_4_ = auVar86._4_4_ * auVar98._4_4_;
        auVar45._0_4_ = auVar86._0_4_ * auVar98._0_4_;
        auVar45._8_4_ = auVar86._8_4_ * auVar98._8_4_;
        auVar45._12_4_ = auVar86._12_4_ * auVar98._12_4_;
        auVar45._16_4_ = auVar98._16_4_ * 0.0;
        auVar45._20_4_ = auVar98._20_4_ * 0.0;
        auVar45._24_4_ = auVar98._24_4_ * 0.0;
        auVar45._28_4_ = auVar217._0_4_;
        auVar98 = vfmadd213ps_avx512vl(auVar120,auVar44,auVar103);
        auVar257._0_4_ = fVar155 * auVar98._0_4_;
        auVar257._4_4_ = fVar171 * auVar98._4_4_;
        auVar257._8_4_ = fVar172 * auVar98._8_4_;
        auVar257._12_4_ = fVar173 * auVar98._12_4_;
        auVar257._16_4_ = fVar175 * auVar98._16_4_;
        auVar257._20_4_ = fVar174 * auVar98._20_4_;
        auVar257._24_4_ = fVar176 * auVar98._24_4_;
        auVar257._28_4_ = 0;
        auVar98 = vmulps_avx512vl(local_520,auVar44);
        auVar104 = vmulps_avx512vl(local_540,auVar44);
        auVar108 = vmulps_avx512vl(_local_560,auVar44);
        auVar107 = vfmadd213ps_avx512vl(auVar100,auVar257,auVar226);
        auVar98 = vsubps_avx512vl(auVar98,auVar107);
        auVar107 = vfmadd213ps_avx512vl(auVar101,auVar257,auVar106);
        auVar107 = vsubps_avx512vl(auVar104,auVar107);
        auVar86 = vfmadd213ps_fma(auVar257,auVar102,auVar105);
        auVar104 = vsubps_avx(auVar108,ZEXT1632(auVar86));
        auVar256 = auVar104._0_28_;
        auVar103 = vfmadd213ps_avx512vl(auVar120,auVar45,auVar103);
        auVar99 = vmulps_avx512vl(auVar99,auVar103);
        auVar269 = ZEXT3264(auVar99);
        auVar103 = vmulps_avx512vl(local_520,auVar45);
        auVar108 = vmulps_avx512vl(local_540,auVar45);
        auVar109 = vmulps_avx512vl(_local_560,auVar45);
        auVar86 = vfmadd213ps_fma(auVar100,auVar99,auVar226);
        auVar104 = vsubps_avx(auVar103,ZEXT1632(auVar86));
        auVar86 = vfmadd213ps_fma(auVar101,auVar99,auVar106);
        auVar100 = vsubps_avx512vl(auVar108,ZEXT1632(auVar86));
        auVar86 = vfmadd213ps_fma(auVar102,auVar99,auVar105);
        auVar101 = vsubps_avx512vl(auVar109,ZEXT1632(auVar86));
        auVar246 = ZEXT3264(auVar101);
        auVar200._8_4_ = 0x7f800000;
        auVar200._0_8_ = 0x7f8000007f800000;
        auVar200._12_4_ = 0x7f800000;
        auVar200._16_4_ = 0x7f800000;
        auVar200._20_4_ = 0x7f800000;
        auVar200._24_4_ = 0x7f800000;
        auVar200._28_4_ = 0x7f800000;
        auVar101 = vblendmps_avx512vl(auVar200,auVar44);
        bVar61 = (bool)((byte)uVar64 & 1);
        auVar118._0_4_ = (uint)bVar61 * auVar101._0_4_ | (uint)!bVar61 * 0x7f800000;
        bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar61 * auVar101._4_4_ | (uint)!bVar61 * 0x7f800000;
        bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar61 * auVar101._8_4_ | (uint)!bVar61 * 0x7f800000;
        bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar61 * auVar101._12_4_ | (uint)!bVar61 * 0x7f800000;
        bVar61 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar118._16_4_ = (uint)bVar61 * auVar101._16_4_ | (uint)!bVar61 * 0x7f800000;
        bVar61 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar118._20_4_ = (uint)bVar61 * auVar101._20_4_ | (uint)!bVar61 * 0x7f800000;
        bVar61 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar118._24_4_ = (uint)bVar61 * auVar101._24_4_ | (uint)!bVar61 * 0x7f800000;
        bVar61 = SUB81(uVar64 >> 7,0);
        auVar118._28_4_ = (uint)bVar61 * auVar101._28_4_ | (uint)!bVar61 * 0x7f800000;
        auVar227._8_4_ = 0xff800000;
        auVar227._0_8_ = 0xff800000ff800000;
        auVar227._12_4_ = 0xff800000;
        auVar227._16_4_ = 0xff800000;
        auVar227._20_4_ = 0xff800000;
        auVar227._24_4_ = 0xff800000;
        auVar227._28_4_ = 0xff800000;
        auVar101 = vblendmps_avx512vl(auVar227,auVar45);
        bVar61 = (bool)((byte)uVar64 & 1);
        auVar120._0_4_ = (uint)bVar61 * auVar101._0_4_ | (uint)!bVar61 * -0x800000;
        bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar61 * auVar101._4_4_ | (uint)!bVar61 * -0x800000;
        bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar61 * auVar101._8_4_ | (uint)!bVar61 * -0x800000;
        bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar61 * auVar101._12_4_ | (uint)!bVar61 * -0x800000;
        bVar61 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar120._16_4_ = (uint)bVar61 * auVar101._16_4_ | (uint)!bVar61 * -0x800000;
        bVar61 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar120._20_4_ = (uint)bVar61 * auVar101._20_4_ | (uint)!bVar61 * -0x800000;
        bVar61 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar120._24_4_ = (uint)bVar61 * auVar101._24_4_ | (uint)!bVar61 * -0x800000;
        bVar61 = SUB81(uVar64 >> 7,0);
        auVar120._28_4_ = (uint)bVar61 * auVar101._28_4_ | (uint)!bVar61 * -0x800000;
        auVar226._8_4_ = 0x36000000;
        auVar226._0_8_ = 0x3600000036000000;
        auVar226._12_4_ = 0x36000000;
        auVar226._16_4_ = 0x36000000;
        auVar226._20_4_ = 0x36000000;
        auVar226._24_4_ = 0x36000000;
        auVar226._28_4_ = 0x36000000;
        auVar101 = vmulps_avx512vl(local_760,auVar226);
        uVar57 = vcmpps_avx512vl(auVar101,local_780,0xe);
        uVar64 = uVar64 & uVar57;
        bVar55 = (byte)uVar64;
        if (bVar55 != 0) {
          uVar57 = vcmpps_avx512vl(auVar96,ZEXT1632(auVar79),2);
          auVar251._8_4_ = 0x7f800000;
          auVar251._0_8_ = 0x7f8000007f800000;
          auVar251._12_4_ = 0x7f800000;
          auVar251._16_4_ = 0x7f800000;
          auVar251._20_4_ = 0x7f800000;
          auVar251._24_4_ = 0x7f800000;
          auVar251._28_4_ = 0x7f800000;
          auVar262._8_4_ = 0xff800000;
          auVar262._0_8_ = 0xff800000ff800000;
          auVar262._12_4_ = 0xff800000;
          auVar262._16_4_ = 0xff800000;
          auVar262._20_4_ = 0xff800000;
          auVar262._24_4_ = 0xff800000;
          auVar262._28_4_ = 0xff800000;
          auVar96 = vblendmps_avx512vl(auVar251,auVar262);
          bVar51 = (byte)uVar57;
          uVar65 = (uint)(bVar51 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar51 & 1) * auVar101._0_4_;
          bVar61 = (bool)((byte)(uVar57 >> 1) & 1);
          uVar133 = (uint)bVar61 * auVar96._4_4_ | (uint)!bVar61 * auVar101._4_4_;
          bVar61 = (bool)((byte)(uVar57 >> 2) & 1);
          uVar134 = (uint)bVar61 * auVar96._8_4_ | (uint)!bVar61 * auVar101._8_4_;
          bVar61 = (bool)((byte)(uVar57 >> 3) & 1);
          uVar135 = (uint)bVar61 * auVar96._12_4_ | (uint)!bVar61 * auVar101._12_4_;
          bVar61 = (bool)((byte)(uVar57 >> 4) & 1);
          uVar136 = (uint)bVar61 * auVar96._16_4_ | (uint)!bVar61 * auVar101._16_4_;
          bVar61 = (bool)((byte)(uVar57 >> 5) & 1);
          uVar137 = (uint)bVar61 * auVar96._20_4_ | (uint)!bVar61 * auVar101._20_4_;
          bVar61 = (bool)((byte)(uVar57 >> 6) & 1);
          uVar138 = (uint)bVar61 * auVar96._24_4_ | (uint)!bVar61 * auVar101._24_4_;
          bVar61 = SUB81(uVar57 >> 7,0);
          uVar139 = (uint)bVar61 * auVar96._28_4_ | (uint)!bVar61 * auVar101._28_4_;
          auVar118._0_4_ = (bVar55 & 1) * uVar65 | !(bool)(bVar55 & 1) * auVar118._0_4_;
          bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar118._4_4_ = bVar61 * uVar133 | !bVar61 * auVar118._4_4_;
          bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar118._8_4_ = bVar61 * uVar134 | !bVar61 * auVar118._8_4_;
          bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar118._12_4_ = bVar61 * uVar135 | !bVar61 * auVar118._12_4_;
          bVar61 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar118._16_4_ = bVar61 * uVar136 | !bVar61 * auVar118._16_4_;
          bVar61 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar118._20_4_ = bVar61 * uVar137 | !bVar61 * auVar118._20_4_;
          bVar61 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar118._24_4_ = bVar61 * uVar138 | !bVar61 * auVar118._24_4_;
          bVar61 = SUB81(uVar64 >> 7,0);
          auVar118._28_4_ = bVar61 * uVar139 | !bVar61 * auVar118._28_4_;
          auVar96 = vblendmps_avx512vl(auVar262,auVar251);
          bVar61 = (bool)((byte)(uVar57 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar57 >> 2) & 1);
          bVar12 = (bool)((byte)(uVar57 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar57 >> 4) & 1);
          bVar14 = (bool)((byte)(uVar57 >> 5) & 1);
          bVar15 = (bool)((byte)(uVar57 >> 6) & 1);
          bVar16 = SUB81(uVar57 >> 7,0);
          auVar120._0_4_ =
               (uint)(bVar55 & 1) *
               ((uint)(bVar51 & 1) * auVar96._0_4_ | !(bool)(bVar51 & 1) * uVar65) |
               !(bool)(bVar55 & 1) * auVar120._0_4_;
          bVar10 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar120._4_4_ =
               (uint)bVar10 * ((uint)bVar61 * auVar96._4_4_ | !bVar61 * uVar133) |
               !bVar10 * auVar120._4_4_;
          bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar120._8_4_ =
               (uint)bVar61 * ((uint)bVar11 * auVar96._8_4_ | !bVar11 * uVar134) |
               !bVar61 * auVar120._8_4_;
          bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar120._12_4_ =
               (uint)bVar61 * ((uint)bVar12 * auVar96._12_4_ | !bVar12 * uVar135) |
               !bVar61 * auVar120._12_4_;
          bVar61 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar120._16_4_ =
               (uint)bVar61 * ((uint)bVar13 * auVar96._16_4_ | !bVar13 * uVar136) |
               !bVar61 * auVar120._16_4_;
          bVar61 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar120._20_4_ =
               (uint)bVar61 * ((uint)bVar14 * auVar96._20_4_ | !bVar14 * uVar137) |
               !bVar61 * auVar120._20_4_;
          bVar61 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar120._24_4_ =
               (uint)bVar61 * ((uint)bVar15 * auVar96._24_4_ | !bVar15 * uVar138) |
               !bVar61 * auVar120._24_4_;
          bVar61 = SUB81(uVar64 >> 7,0);
          auVar120._28_4_ =
               (uint)bVar61 * ((uint)bVar16 * auVar96._28_4_ | !bVar16 * uVar139) |
               !bVar61 * auVar120._28_4_;
          bVar58 = (~bVar55 | bVar51) & bVar58;
        }
      }
      auVar96 = vmovdqa64_avx512vl(auVar88);
      auVar270 = ZEXT3264(auVar96);
      auVar96 = vmovdqa64_avx512vl(auVar89);
      auVar271 = ZEXT3264(auVar96);
      auVar96 = vmovdqa64_avx512vl(auVar90);
      auVar272 = ZEXT3264(auVar96);
      auVar252._0_4_ = (float)local_560._0_4_ * auVar246._0_4_;
      auVar252._4_4_ = (float)local_560._4_4_ * auVar246._4_4_;
      auVar252._8_4_ = fStack_558 * auVar246._8_4_;
      auVar252._12_4_ = fStack_554 * auVar246._12_4_;
      auVar252._16_4_ = fStack_550 * auVar246._16_4_;
      auVar252._20_4_ = fStack_54c * auVar246._20_4_;
      auVar252._28_36_ = auVar246._28_36_;
      auVar252._24_4_ = fStack_548 * auVar246._24_4_;
      auVar86 = vfmadd231ps_fma(auVar252._0_32_,local_540,auVar100);
      auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),local_520,auVar104);
      auVar249._8_4_ = 0x7fffffff;
      auVar249._0_8_ = 0x7fffffff7fffffff;
      auVar249._12_4_ = 0x7fffffff;
      auVar249._16_4_ = 0x7fffffff;
      auVar249._20_4_ = 0x7fffffff;
      auVar249._24_4_ = 0x7fffffff;
      auVar249._28_4_ = 0x7fffffff;
      auVar96 = vandps_avx(ZEXT1632(auVar86),auVar249);
      _local_1c0 = local_500;
      auVar245._8_4_ = 0x3e99999a;
      auVar245._0_8_ = 0x3e99999a3e99999a;
      auVar245._12_4_ = 0x3e99999a;
      auVar245._16_4_ = 0x3e99999a;
      auVar245._20_4_ = 0x3e99999a;
      auVar245._24_4_ = 0x3e99999a;
      auVar245._28_4_ = 0x3e99999a;
      uVar20 = vcmpps_avx512vl(auVar96,auVar245,1);
      _local_4c0 = vmaxps_avx(local_500,auVar120);
      _local_2c0 = _local_4c0;
      auVar96 = vminps_avx(local_2a0,auVar118);
      uVar22 = vcmpps_avx512vl(local_500,auVar96,2);
      bVar55 = (byte)uVar22 & bVar50;
      uVar21 = vcmpps_avx512vl(_local_4c0,local_2a0,2);
      if ((bVar50 & ((byte)uVar21 | (byte)uVar22)) == 0) {
        auVar240 = ZEXT3264(auVar249);
        auVar273 = ZEXT3264(local_7e0);
        auVar265 = ZEXT3264(local_800);
        auVar255 = ZEXT3264(local_820);
        auVar263 = ZEXT3264(local_840);
        auVar246 = ZEXT3264(local_860);
        auVar252 = ZEXT3264(local_880);
      }
      else {
        bVar51 = (byte)uVar20 | ~bVar58;
        auVar46._4_4_ = (float)local_560._4_4_ * auVar256._4_4_;
        auVar46._0_4_ = (float)local_560._0_4_ * auVar256._0_4_;
        auVar46._8_4_ = fStack_558 * auVar256._8_4_;
        auVar46._12_4_ = fStack_554 * auVar256._12_4_;
        auVar46._16_4_ = fStack_550 * auVar256._16_4_;
        auVar46._20_4_ = fStack_54c * auVar256._20_4_;
        auVar46._24_4_ = fStack_548 * auVar256._24_4_;
        auVar46._28_4_ = auVar96._28_4_;
        auVar86 = vfmadd213ps_fma(auVar107,local_540,auVar46);
        auVar86 = vfmadd213ps_fma(auVar98,local_520,ZEXT1632(auVar86));
        auVar96 = vandps_avx(ZEXT1632(auVar86),auVar249);
        uVar20 = vcmpps_avx512vl(auVar96,auVar245,1);
        bVar58 = (byte)uVar20 | ~bVar58;
        auVar150._8_4_ = 2;
        auVar150._0_8_ = 0x200000002;
        auVar150._12_4_ = 2;
        auVar150._16_4_ = 2;
        auVar150._20_4_ = 2;
        auVar150._24_4_ = 2;
        auVar150._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar96 = vpblendmd_avx512vl(auVar150,auVar35);
        local_280._0_4_ = (uint)(bVar58 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar58 & 1) * 2;
        bVar61 = (bool)(bVar58 >> 1 & 1);
        local_280._4_4_ = (uint)bVar61 * auVar96._4_4_ | (uint)!bVar61 * 2;
        bVar61 = (bool)(bVar58 >> 2 & 1);
        local_280._8_4_ = (uint)bVar61 * auVar96._8_4_ | (uint)!bVar61 * 2;
        bVar61 = (bool)(bVar58 >> 3 & 1);
        local_280._12_4_ = (uint)bVar61 * auVar96._12_4_ | (uint)!bVar61 * 2;
        bVar61 = (bool)(bVar58 >> 4 & 1);
        local_280._16_4_ = (uint)bVar61 * auVar96._16_4_ | (uint)!bVar61 * 2;
        bVar61 = (bool)(bVar58 >> 5 & 1);
        local_280._20_4_ = (uint)bVar61 * auVar96._20_4_ | (uint)!bVar61 * 2;
        bVar61 = (bool)(bVar58 >> 6 & 1);
        local_280._24_4_ = (uint)bVar61 * auVar96._24_4_ | (uint)!bVar61 * 2;
        local_280._28_4_ = (uint)(bVar58 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar58 >> 7) * 2;
        local_440 = vpbroadcastd_avx512vl();
        uVar20 = vpcmpd_avx512vl(local_440,local_280,5);
        local_4a0 = local_500._0_4_ + (float)local_4e0._0_4_;
        fStack_49c = local_500._4_4_ + (float)local_4e0._4_4_;
        fStack_498 = local_500._8_4_ + fStack_4d8;
        fStack_494 = local_500._12_4_ + fStack_4d4;
        fStack_490 = local_500._16_4_ + fStack_4d0;
        fStack_48c = local_500._20_4_ + fStack_4cc;
        fStack_488 = local_500._24_4_ + fStack_4c8;
        fStack_484 = local_500._28_4_ + fStack_4c4;
        for (bVar58 = (byte)uVar20 & bVar55; bVar58 != 0; bVar58 = ~bVar56 & bVar58 & (byte)uVar20)
        {
          auVar151._8_4_ = 0x7f800000;
          auVar151._0_8_ = 0x7f8000007f800000;
          auVar151._12_4_ = 0x7f800000;
          auVar151._16_4_ = 0x7f800000;
          auVar151._20_4_ = 0x7f800000;
          auVar151._24_4_ = 0x7f800000;
          auVar151._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar151,local_500);
          auVar129._0_4_ =
               (uint)(bVar58 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar58 & 1) * 0x7f800000;
          bVar61 = (bool)(bVar58 >> 1 & 1);
          auVar129._4_4_ = (uint)bVar61 * auVar96._4_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar58 >> 2 & 1);
          auVar129._8_4_ = (uint)bVar61 * auVar96._8_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar58 >> 3 & 1);
          auVar129._12_4_ = (uint)bVar61 * auVar96._12_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar58 >> 4 & 1);
          auVar129._16_4_ = (uint)bVar61 * auVar96._16_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar58 >> 5 & 1);
          auVar129._20_4_ = (uint)bVar61 * auVar96._20_4_ | (uint)!bVar61 * 0x7f800000;
          auVar129._24_4_ =
               (uint)(bVar58 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar58 >> 6) * 0x7f800000;
          auVar129._28_4_ = 0x7f800000;
          auVar96 = vshufps_avx(auVar129,auVar129,0xb1);
          auVar96 = vminps_avx(auVar129,auVar96);
          auVar98 = vshufpd_avx(auVar96,auVar96,5);
          auVar96 = vminps_avx(auVar96,auVar98);
          auVar98 = vpermpd_avx2(auVar96,0x4e);
          auVar96 = vminps_avx(auVar96,auVar98);
          uVar20 = vcmpps_avx512vl(auVar129,auVar96,0);
          bVar52 = (byte)uVar20 & bVar58;
          bVar56 = bVar58;
          if (bVar52 != 0) {
            bVar56 = bVar52;
          }
          iVar23 = 0;
          for (uVar65 = (uint)bVar56; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
            iVar23 = iVar23 + 1;
          }
          bVar56 = '\x01' << ((byte)iVar23 & 0x1f);
          uVar65 = *(uint *)(local_1e0 + (uint)(iVar23 << 2));
          uVar133 = *(uint *)(local_1c0 + (uint)(iVar23 << 2));
          fVar155 = auVar84._0_4_;
          if ((float)local_7c0._0_4_ < 0.0) {
            auVar269 = ZEXT1664(auVar269._0_16_);
            fVar155 = sqrtf((float)local_7c0._0_4_);
            auVar96 = vmovdqa64_avx512vl(auVar90);
            auVar272 = ZEXT3264(auVar96);
            auVar96 = vmovdqa64_avx512vl(auVar89);
            auVar271 = ZEXT3264(auVar96);
            auVar96 = vmovdqa64_avx512vl(auVar88);
            auVar270 = ZEXT3264(auVar96);
          }
          uVar64 = (ulong)bVar56;
          auVar79 = vminps_avx(local_620._0_16_,local_660._0_16_);
          auVar86 = vmaxps_avx(local_620._0_16_,local_660._0_16_);
          auVar3 = vminps_avx(local_640._0_16_,local_680._0_16_);
          auVar70 = vminps_avx(auVar79,auVar3);
          auVar79 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
          auVar3 = vmaxps_avx(auVar86,auVar79);
          auVar205._8_4_ = 0x7fffffff;
          auVar205._0_8_ = 0x7fffffff7fffffff;
          auVar205._12_4_ = 0x7fffffff;
          auVar86 = vandps_avx(auVar70,auVar205);
          auVar79 = vandps_avx(auVar3,auVar205);
          auVar86 = vmaxps_avx(auVar86,auVar79);
          auVar79 = vmovshdup_avx(auVar86);
          auVar79 = vmaxss_avx(auVar79,auVar86);
          auVar86 = vshufpd_avx(auVar86,auVar86,1);
          auVar86 = vmaxss_avx(auVar86,auVar79);
          local_780._0_4_ = auVar86._0_4_ * 1.9073486e-06;
          local_6e0 = vshufps_avx(auVar3,auVar3,0xff);
          auVar86 = vinsertps_avx(ZEXT416(uVar133),ZEXT416(uVar65),0x10);
          uVar57 = 0;
          while( true ) {
            bVar52 = (byte)uVar64;
            if (uVar57 == 5) break;
            uVar156 = auVar86._0_4_;
            auVar143._4_4_ = uVar156;
            auVar143._0_4_ = uVar156;
            auVar143._8_4_ = uVar156;
            auVar143._12_4_ = uVar156;
            auVar3 = vfmadd132ps_fma(auVar143,ZEXT816(0) << 0x40,local_7b0);
            auVar79 = vmovshdup_avx(auVar86);
            local_6a0._0_16_ = auVar79;
            fVar174 = 1.0 - auVar79._0_4_;
            auVar79 = vshufps_avx(auVar86,auVar86,0x55);
            fVar171 = auVar79._0_4_;
            auVar181._0_4_ = local_660._0_4_ * fVar171;
            fVar172 = auVar79._4_4_;
            auVar181._4_4_ = local_660._4_4_ * fVar172;
            fVar173 = auVar79._8_4_;
            auVar181._8_4_ = local_660._8_4_ * fVar173;
            fVar175 = auVar79._12_4_;
            auVar181._12_4_ = local_660._12_4_ * fVar175;
            _local_5a0 = ZEXT416((uint)fVar174);
            auVar206._4_4_ = fVar174;
            auVar206._0_4_ = fVar174;
            auVar206._8_4_ = fVar174;
            auVar206._12_4_ = fVar174;
            auVar79 = vfmadd231ps_fma(auVar181,auVar206,local_620._0_16_);
            auVar222._0_4_ = local_640._0_4_ * fVar171;
            auVar222._4_4_ = local_640._4_4_ * fVar172;
            auVar222._8_4_ = local_640._8_4_ * fVar173;
            auVar222._12_4_ = local_640._12_4_ * fVar175;
            auVar70 = vfmadd231ps_fma(auVar222,auVar206,local_660._0_16_);
            auVar233._0_4_ = fVar171 * (float)local_680._0_4_;
            auVar233._4_4_ = fVar172 * (float)local_680._4_4_;
            auVar233._8_4_ = fVar173 * fStack_678;
            auVar233._12_4_ = fVar175 * fStack_674;
            auVar76 = vfmadd231ps_fma(auVar233,auVar206,local_640._0_16_);
            auVar243._0_4_ = fVar171 * auVar70._0_4_;
            auVar243._4_4_ = fVar172 * auVar70._4_4_;
            auVar243._8_4_ = fVar173 * auVar70._8_4_;
            auVar243._12_4_ = fVar175 * auVar70._12_4_;
            auVar79 = vfmadd231ps_fma(auVar243,auVar206,auVar79);
            auVar182._0_4_ = fVar171 * auVar76._0_4_;
            auVar182._4_4_ = fVar172 * auVar76._4_4_;
            auVar182._8_4_ = fVar173 * auVar76._8_4_;
            auVar182._12_4_ = fVar175 * auVar76._12_4_;
            auVar70 = vfmadd231ps_fma(auVar182,auVar206,auVar70);
            auVar223._0_4_ = fVar171 * auVar70._0_4_;
            auVar223._4_4_ = fVar172 * auVar70._4_4_;
            auVar223._8_4_ = fVar173 * auVar70._8_4_;
            auVar223._12_4_ = fVar175 * auVar70._12_4_;
            auVar76 = vfmadd231ps_fma(auVar223,auVar79,auVar206);
            auVar79 = vsubps_avx(auVar70,auVar79);
            auVar24._8_4_ = 0x40400000;
            auVar24._0_8_ = 0x4040000040400000;
            auVar24._12_4_ = 0x40400000;
            auVar70 = vmulps_avx512vl(auVar79,auVar24);
            local_580._0_16_ = auVar76;
            auVar3 = vsubps_avx(auVar3,auVar76);
            auVar79 = vdpps_avx(auVar3,auVar3,0x7f);
            fVar171 = auVar79._0_4_;
            local_740 = ZEXT1632(auVar86);
            if (fVar171 < 0.0) {
              auVar246._0_4_ = sqrtf(fVar171);
              auVar246._4_60_ = extraout_var;
              auVar86 = auVar246._0_16_;
              uVar64 = extraout_RAX;
            }
            else {
              auVar86 = vsqrtss_avx(auVar79,auVar79);
            }
            local_5c0._0_16_ = vdpps_avx(auVar70,auVar70,0x7f);
            fVar172 = local_5c0._0_4_;
            auVar183._4_12_ = ZEXT812(0) << 0x20;
            auVar183._0_4_ = fVar172;
            local_760._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar183);
            fVar173 = local_760._0_4_;
            local_5e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar183);
            auVar25._8_4_ = 0x80000000;
            auVar25._0_8_ = 0x8000000080000000;
            auVar25._12_4_ = 0x80000000;
            auVar72 = vxorps_avx512vl(local_5c0._0_16_,auVar25);
            auVar76 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
            local_600._0_4_ = auVar76._0_4_;
            local_7a0._0_4_ = auVar86._0_4_;
            if (fVar172 < auVar72._0_4_) {
              fVar175 = sqrtf(fVar172);
              auVar86 = ZEXT416((uint)local_7a0._0_4_);
              uVar64 = extraout_RAX_00;
            }
            else {
              auVar76 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
              fVar175 = auVar76._0_4_;
            }
            fVar174 = local_760._0_4_;
            fVar172 = fVar173 * 1.5 + fVar172 * -0.5 * fVar174 * fVar174 * fVar174;
            local_760._0_4_ = auVar70._0_4_ * fVar172;
            local_760._4_4_ = auVar70._4_4_ * fVar172;
            local_760._8_4_ = auVar70._8_4_ * fVar172;
            local_760._12_4_ = auVar70._12_4_ * fVar172;
            auVar76 = vdpps_avx(auVar3,local_760._0_16_,0x7f);
            fVar176 = auVar86._0_4_;
            fVar173 = auVar76._0_4_;
            auVar144._0_4_ = fVar173 * fVar173;
            auVar144._4_4_ = auVar76._4_4_ * auVar76._4_4_;
            auVar144._8_4_ = auVar76._8_4_ * auVar76._8_4_;
            auVar144._12_4_ = auVar76._12_4_ * auVar76._12_4_;
            auVar73 = vsubps_avx512vl(auVar79,auVar144);
            fVar174 = auVar73._0_4_;
            auVar161._4_12_ = ZEXT812(0) << 0x20;
            auVar161._0_4_ = fVar174;
            auVar72 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar161);
            auVar74 = vmulss_avx512f(auVar72,ZEXT416(0x3fc00000));
            auVar75 = vmulss_avx512f(auVar73,ZEXT416(0xbf000000));
            in_ZMM26 = ZEXT1664(auVar75);
            if (fVar174 < 0.0) {
              local_6d0 = fVar172;
              fStack_6cc = fVar172;
              fStack_6c8 = fVar172;
              fStack_6c4 = fVar172;
              local_6c0 = auVar72;
              fVar174 = sqrtf(fVar174);
              in_ZMM26 = ZEXT464(auVar75._0_4_);
              auVar74 = ZEXT416(auVar74._0_4_);
              auVar86 = ZEXT416((uint)local_7a0._0_4_);
              uVar64 = extraout_RAX_01;
              auVar72 = local_6c0;
              fVar172 = local_6d0;
              fVar177 = fStack_6cc;
              fVar258 = fStack_6c8;
              fVar179 = fStack_6c4;
            }
            else {
              auVar73 = vsqrtss_avx(auVar73,auVar73);
              fVar174 = auVar73._0_4_;
              fVar177 = fVar172;
              fVar258 = fVar172;
              fVar179 = fVar172;
            }
            auVar269 = ZEXT1664(auVar72);
            auVar96 = vmovdqa64_avx512vl(auVar88);
            auVar270 = ZEXT3264(auVar96);
            auVar96 = vmovdqa64_avx512vl(auVar89);
            auVar271 = ZEXT3264(auVar96);
            auVar96 = vmovdqa64_avx512vl(auVar90);
            auVar272 = ZEXT3264(auVar96);
            auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_5a0,local_6a0._0_16_);
            auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_6a0._0_16_,_local_5a0);
            fVar178 = auVar73._0_4_ * 6.0;
            fVar18 = local_6a0._0_4_ * 6.0;
            auVar207._0_4_ = fVar18 * (float)local_680._0_4_;
            auVar207._4_4_ = fVar18 * (float)local_680._4_4_;
            auVar207._8_4_ = fVar18 * fStack_678;
            auVar207._12_4_ = fVar18 * fStack_674;
            auVar184._4_4_ = fVar178;
            auVar184._0_4_ = fVar178;
            auVar184._8_4_ = fVar178;
            auVar184._12_4_ = fVar178;
            auVar73 = vfmadd132ps_fma(auVar184,auVar207,local_640._0_16_);
            fVar178 = auVar75._0_4_ * 6.0;
            auVar162._4_4_ = fVar178;
            auVar162._0_4_ = fVar178;
            auVar162._8_4_ = fVar178;
            auVar162._12_4_ = fVar178;
            auVar73 = vfmadd132ps_fma(auVar162,auVar73,local_660._0_16_);
            fVar178 = local_5a0._0_4_ * 6.0;
            auVar185._4_4_ = fVar178;
            auVar185._0_4_ = fVar178;
            auVar185._8_4_ = fVar178;
            auVar185._12_4_ = fVar178;
            auVar73 = vfmadd132ps_fma(auVar185,auVar73,local_620._0_16_);
            auVar163._0_4_ = auVar73._0_4_ * (float)local_5c0._0_4_;
            auVar163._4_4_ = auVar73._4_4_ * (float)local_5c0._0_4_;
            auVar163._8_4_ = auVar73._8_4_ * (float)local_5c0._0_4_;
            auVar163._12_4_ = auVar73._12_4_ * (float)local_5c0._0_4_;
            auVar73 = vdpps_avx(auVar70,auVar73,0x7f);
            fVar178 = auVar73._0_4_;
            auVar186._0_4_ = auVar70._0_4_ * fVar178;
            auVar186._4_4_ = auVar70._4_4_ * fVar178;
            auVar186._8_4_ = auVar70._8_4_ * fVar178;
            auVar186._12_4_ = auVar70._12_4_ * fVar178;
            auVar73 = vsubps_avx(auVar163,auVar186);
            fVar178 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
            auVar75 = vmaxss_avx(ZEXT416((uint)local_780._0_4_),
                                 ZEXT416((uint)(local_740._0_4_ * fVar155 * 1.9073486e-06)));
            auVar26._8_4_ = 0x80000000;
            auVar26._0_8_ = 0x8000000080000000;
            auVar26._12_4_ = 0x80000000;
            auVar131._16_16_ = auVar95._16_16_;
            auVar87 = vxorps_avx512vl(auVar70,auVar26);
            auVar187._0_4_ = fVar172 * auVar73._0_4_ * fVar178;
            auVar187._4_4_ = fVar177 * auVar73._4_4_ * fVar178;
            auVar187._8_4_ = fVar258 * auVar73._8_4_ * fVar178;
            auVar187._12_4_ = fVar179 * auVar73._12_4_ * fVar178;
            auVar73 = vdpps_avx(auVar87,local_760._0_16_,0x7f);
            auVar77 = vfmadd213ss_fma(auVar86,ZEXT416((uint)local_780._0_4_),auVar75);
            auVar86 = vdpps_avx(auVar3,auVar187,0x7f);
            auVar78 = vfmadd213ss_fma(ZEXT416((uint)(fVar176 + 1.0)),
                                      ZEXT416((uint)((float)local_780._0_4_ / fVar175)),auVar77);
            fVar172 = auVar73._0_4_ + auVar86._0_4_;
            auVar86 = vdpps_avx(local_7b0,local_760._0_16_,0x7f);
            auVar73 = vdpps_avx(auVar3,auVar87,0x7f);
            auVar77 = vmulss_avx512f(in_ZMM26._0_16_,auVar72);
            auVar80 = vaddss_avx512f(auVar74,ZEXT416((uint)(auVar77._0_4_ *
                                                           auVar72._0_4_ * auVar72._0_4_)));
            auVar74 = vdpps_avx(auVar3,local_7b0,0x7f);
            auVar87 = vfnmadd231ss_fma(auVar73,auVar76,ZEXT416((uint)fVar172));
            auVar74 = vfnmadd231ss_fma(auVar74,auVar76,auVar86);
            auVar73 = vpermilps_avx(local_580._0_16_,0xff);
            fVar174 = fVar174 - auVar73._0_4_;
            auVar77 = vshufps_avx(auVar70,auVar70,0xff);
            auVar73 = vfmsub213ss_fma(auVar87,auVar80,auVar77);
            auVar247._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
            auVar247._8_4_ = auVar73._8_4_ ^ 0x80000000;
            auVar247._12_4_ = auVar73._12_4_ ^ 0x80000000;
            auVar74 = ZEXT416((uint)(auVar74._0_4_ * auVar80._0_4_));
            auVar87 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar73._0_4_)),
                                      ZEXT416((uint)fVar172),auVar74);
            auVar73 = vinsertps_avx(auVar247,auVar74,0x1c);
            auVar234._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
            auVar234._8_4_ = auVar86._8_4_ ^ 0x80000000;
            auVar234._12_4_ = auVar86._12_4_ ^ 0x80000000;
            auVar74 = vinsertps_avx(ZEXT416((uint)fVar172),auVar234,0x10);
            auVar208._0_4_ = auVar87._0_4_;
            auVar208._4_4_ = auVar208._0_4_;
            auVar208._8_4_ = auVar208._0_4_;
            auVar208._12_4_ = auVar208._0_4_;
            auVar86 = vdivps_avx(auVar73,auVar208);
            auVar73 = vdivps_avx(auVar74,auVar208);
            auVar209._0_4_ = fVar173 * auVar86._0_4_ + fVar174 * auVar73._0_4_;
            auVar209._4_4_ = fVar173 * auVar86._4_4_ + fVar174 * auVar73._4_4_;
            auVar209._8_4_ = fVar173 * auVar86._8_4_ + fVar174 * auVar73._8_4_;
            auVar209._12_4_ = fVar173 * auVar86._12_4_ + fVar174 * auVar73._12_4_;
            auVar86 = vsubps_avx(local_740._0_16_,auVar209);
            auVar27._8_4_ = 0x7fffffff;
            auVar27._0_8_ = 0x7fffffff7fffffff;
            auVar27._12_4_ = 0x7fffffff;
            auVar76 = vandps_avx512vl(auVar76,auVar27);
            if (auVar76._0_4_ < auVar78._0_4_) {
              auVar76 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ + auVar75._0_4_)),local_6e0,
                                        ZEXT416(0x36000000));
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar73 = vandps_avx512vl(ZEXT416((uint)fVar174),auVar28);
              if (auVar73._0_4_ < auVar76._0_4_) {
                bVar61 = uVar57 < 5;
                fVar155 = auVar86._0_4_ + (float)local_6f0._0_4_;
                if (fVar155 < fVar2) {
LAB_018a101a:
                  bVar52 = 0;
                  goto LAB_018a1022;
                }
                fVar172 = *(float *)(ray + k * 4 + 0x100);
                if (fVar155 <= fVar172) {
                  auVar76 = vmovshdup_avx(auVar86);
                  bVar52 = 0;
                  if ((auVar76._0_4_ < 0.0) || (1.0 < auVar76._0_4_)) goto LAB_018a1022;
                  auVar210._0_12_ = ZEXT812(0);
                  auVar210._12_4_ = 0;
                  auVar131._0_16_ = auVar210;
                  auVar130._4_28_ = auVar131._4_28_;
                  auVar130._0_4_ = fVar171;
                  auVar76 = vrsqrt14ss_avx512f(auVar210,auVar130._0_16_);
                  fVar171 = auVar76._0_4_;
                  auVar79 = vmulss_avx512f(auVar79,ZEXT416(0xbf000000));
                  pGVar5 = (context->scene->geometries).items[uVar4].ptr;
                  if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_018a101a;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar52 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_018a1022;
                  fVar171 = fVar171 * 1.5 + auVar79._0_4_ * fVar171 * fVar171 * fVar171;
                  auVar188._0_4_ = auVar3._0_4_ * fVar171;
                  auVar188._4_4_ = auVar3._4_4_ * fVar171;
                  auVar188._8_4_ = auVar3._8_4_ * fVar171;
                  auVar188._12_4_ = auVar3._12_4_ * fVar171;
                  auVar76 = vfmadd213ps_fma(auVar77,auVar188,auVar70);
                  auVar79 = vshufps_avx(auVar188,auVar188,0xc9);
                  auVar3 = vshufps_avx(auVar70,auVar70,0xc9);
                  auVar189._0_4_ = auVar188._0_4_ * auVar3._0_4_;
                  auVar189._4_4_ = auVar188._4_4_ * auVar3._4_4_;
                  auVar189._8_4_ = auVar188._8_4_ * auVar3._8_4_;
                  auVar189._12_4_ = auVar188._12_4_ * auVar3._12_4_;
                  auVar70 = vfmsub231ps_fma(auVar189,auVar70,auVar79);
                  auVar79 = vshufps_avx(auVar70,auVar70,0xc9);
                  auVar3 = vshufps_avx(auVar76,auVar76,0xc9);
                  auVar70 = vshufps_avx(auVar70,auVar70,0xd2);
                  auVar145._0_4_ = auVar76._0_4_ * auVar70._0_4_;
                  auVar145._4_4_ = auVar76._4_4_ * auVar70._4_4_;
                  auVar145._8_4_ = auVar76._8_4_ * auVar70._8_4_;
                  auVar145._12_4_ = auVar76._12_4_ * auVar70._12_4_;
                  auVar79 = vfmsub231ps_fma(auVar145,auVar79,auVar3);
                  auVar218._8_4_ = 1;
                  auVar218._0_8_ = 0x100000001;
                  auVar218._12_4_ = 1;
                  auVar218._16_4_ = 1;
                  auVar218._20_4_ = 1;
                  auVar218._24_4_ = 1;
                  auVar218._28_4_ = 1;
                  local_380 = vpermps_avx2(auVar218,ZEXT1632(auVar86));
                  auVar96 = vpermps_avx2(auVar218,ZEXT1632(auVar79));
                  auVar228._8_4_ = 2;
                  auVar228._0_8_ = 0x200000002;
                  auVar228._12_4_ = 2;
                  auVar228._16_4_ = 2;
                  auVar228._20_4_ = 2;
                  auVar228._24_4_ = 2;
                  auVar228._28_4_ = 2;
                  local_3c0 = vpermps_avx2(auVar228,ZEXT1632(auVar79));
                  local_3a0 = auVar79._0_4_;
                  local_3e0[0] = (RTCHitN)auVar96[0];
                  local_3e0[1] = (RTCHitN)auVar96[1];
                  local_3e0[2] = (RTCHitN)auVar96[2];
                  local_3e0[3] = (RTCHitN)auVar96[3];
                  local_3e0[4] = (RTCHitN)auVar96[4];
                  local_3e0[5] = (RTCHitN)auVar96[5];
                  local_3e0[6] = (RTCHitN)auVar96[6];
                  local_3e0[7] = (RTCHitN)auVar96[7];
                  local_3e0[8] = (RTCHitN)auVar96[8];
                  local_3e0[9] = (RTCHitN)auVar96[9];
                  local_3e0[10] = (RTCHitN)auVar96[10];
                  local_3e0[0xb] = (RTCHitN)auVar96[0xb];
                  local_3e0[0xc] = (RTCHitN)auVar96[0xc];
                  local_3e0[0xd] = (RTCHitN)auVar96[0xd];
                  local_3e0[0xe] = (RTCHitN)auVar96[0xe];
                  local_3e0[0xf] = (RTCHitN)auVar96[0xf];
                  local_3e0[0x10] = (RTCHitN)auVar96[0x10];
                  local_3e0[0x11] = (RTCHitN)auVar96[0x11];
                  local_3e0[0x12] = (RTCHitN)auVar96[0x12];
                  local_3e0[0x13] = (RTCHitN)auVar96[0x13];
                  local_3e0[0x14] = (RTCHitN)auVar96[0x14];
                  local_3e0[0x15] = (RTCHitN)auVar96[0x15];
                  local_3e0[0x16] = (RTCHitN)auVar96[0x16];
                  local_3e0[0x17] = (RTCHitN)auVar96[0x17];
                  local_3e0[0x18] = (RTCHitN)auVar96[0x18];
                  local_3e0[0x19] = (RTCHitN)auVar96[0x19];
                  local_3e0[0x1a] = (RTCHitN)auVar96[0x1a];
                  local_3e0[0x1b] = (RTCHitN)auVar96[0x1b];
                  local_3e0[0x1c] = (RTCHitN)auVar96[0x1c];
                  local_3e0[0x1d] = (RTCHitN)auVar96[0x1d];
                  local_3e0[0x1e] = (RTCHitN)auVar96[0x1e];
                  local_3e0[0x1f] = (RTCHitN)auVar96[0x1f];
                  uStack_39c = local_3a0;
                  uStack_398 = local_3a0;
                  uStack_394 = local_3a0;
                  uStack_390 = local_3a0;
                  uStack_38c = local_3a0;
                  uStack_388 = local_3a0;
                  uStack_384 = local_3a0;
                  local_360 = ZEXT432(0) << 0x20;
                  local_340 = local_400._0_8_;
                  uStack_338 = local_400._8_8_;
                  uStack_330 = local_400._16_8_;
                  uStack_328 = local_400._24_8_;
                  local_320 = local_420;
                  vpcmpeqd_avx2(local_420,local_420);
                  local_300 = context->user->instID[0];
                  uStack_2fc = local_300;
                  uStack_2f8 = local_300;
                  uStack_2f4 = local_300;
                  uStack_2f0 = local_300;
                  uStack_2ec = local_300;
                  uStack_2e8 = local_300;
                  uStack_2e4 = local_300;
                  local_2e0 = context->user->instPrimID[0];
                  uStack_2dc = local_2e0;
                  uStack_2d8 = local_2e0;
                  uStack_2d4 = local_2e0;
                  uStack_2d0 = local_2e0;
                  uStack_2cc = local_2e0;
                  uStack_2c8 = local_2e0;
                  uStack_2c4 = local_2e0;
                  *(float *)(ray + k * 4 + 0x100) = fVar155;
                  local_720 = local_460;
                  local_8b0.valid = (int *)local_720;
                  local_8b0.geometryUserPtr = pGVar5->userPtr;
                  local_8b0.context = context->user;
                  local_8b0.hit = local_3e0;
                  local_8b0.N = 8;
                  local_8b0.ray = (RTCRayN *)ray;
                  if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar269 = ZEXT1664(auVar72);
                    (*pGVar5->occlusionFilterN)(&local_8b0);
                    auVar96 = vmovdqa64_avx512vl(auVar90);
                    auVar272 = ZEXT3264(auVar96);
                    auVar96 = vmovdqa64_avx512vl(auVar89);
                    auVar271 = ZEXT3264(auVar96);
                    auVar96 = vmovdqa64_avx512vl(auVar88);
                    auVar270 = ZEXT3264(auVar96);
                  }
                  if (local_720 != (undefined1  [32])0x0) {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar269 = ZEXT1664(auVar269._0_16_);
                      (*p_Var9)(&local_8b0);
                      auVar96 = vmovdqa64_avx512vl(auVar90);
                      auVar272 = ZEXT3264(auVar96);
                      auVar96 = vmovdqa64_avx512vl(auVar89);
                      auVar271 = ZEXT3264(auVar96);
                      auVar96 = vmovdqa64_avx512vl(auVar88);
                      auVar270 = ZEXT3264(auVar96);
                    }
                    uVar64 = vptestmd_avx512vl(local_720,local_720);
                    auVar96 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar10 = (bool)((byte)uVar64 & 1);
                    bVar11 = (bool)((byte)(uVar64 >> 1) & 1);
                    bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
                    bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
                    bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
                    bVar15 = (bool)((byte)(uVar64 >> 5) & 1);
                    bVar16 = (bool)((byte)(uVar64 >> 6) & 1);
                    bVar17 = SUB81(uVar64 >> 7,0);
                    *(uint *)(local_8b0.ray + 0x100) =
                         (uint)bVar10 * auVar96._0_4_ |
                         (uint)!bVar10 * *(int *)(local_8b0.ray + 0x100);
                    *(uint *)(local_8b0.ray + 0x104) =
                         (uint)bVar11 * auVar96._4_4_ |
                         (uint)!bVar11 * *(int *)(local_8b0.ray + 0x104);
                    *(uint *)(local_8b0.ray + 0x108) =
                         (uint)bVar12 * auVar96._8_4_ |
                         (uint)!bVar12 * *(int *)(local_8b0.ray + 0x108);
                    *(uint *)(local_8b0.ray + 0x10c) =
                         (uint)bVar13 * auVar96._12_4_ |
                         (uint)!bVar13 * *(int *)(local_8b0.ray + 0x10c);
                    *(uint *)(local_8b0.ray + 0x110) =
                         (uint)bVar14 * auVar96._16_4_ |
                         (uint)!bVar14 * *(int *)(local_8b0.ray + 0x110);
                    *(uint *)(local_8b0.ray + 0x114) =
                         (uint)bVar15 * auVar96._20_4_ |
                         (uint)!bVar15 * *(int *)(local_8b0.ray + 0x114);
                    *(uint *)(local_8b0.ray + 0x118) =
                         (uint)bVar16 * auVar96._24_4_ |
                         (uint)!bVar16 * *(int *)(local_8b0.ray + 0x118);
                    *(uint *)(local_8b0.ray + 0x11c) =
                         (uint)bVar17 * auVar96._28_4_ |
                         (uint)!bVar17 * *(int *)(local_8b0.ray + 0x11c);
                    bVar52 = 1;
                    if (local_720 != (undefined1  [32])0x0) goto LAB_018a1022;
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar172;
                }
                bVar52 = 0;
                goto LAB_018a1022;
              }
            }
            uVar57 = uVar57 + 1;
          }
          bVar61 = false;
LAB_018a1022:
          bVar53 = bVar53 | bVar61 & bVar52;
          uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar238._4_4_ = uVar156;
          auVar238._0_4_ = uVar156;
          auVar238._8_4_ = uVar156;
          auVar238._12_4_ = uVar156;
          auVar238._16_4_ = uVar156;
          auVar238._20_4_ = uVar156;
          auVar238._24_4_ = uVar156;
          auVar238._28_4_ = uVar156;
          auVar240 = ZEXT3264(auVar238);
          auVar48._4_4_ = fStack_49c;
          auVar48._0_4_ = local_4a0;
          auVar48._8_4_ = fStack_498;
          auVar48._12_4_ = fStack_494;
          auVar48._16_4_ = fStack_490;
          auVar48._20_4_ = fStack_48c;
          auVar48._24_4_ = fStack_488;
          auVar48._28_4_ = fStack_484;
          uVar20 = vcmpps_avx512vl(auVar238,auVar48,0xd);
        }
        auVar152._0_4_ = (float)local_4e0._0_4_ + (float)local_4c0._0_4_;
        auVar152._4_4_ = (float)local_4e0._4_4_ + (float)local_4c0._4_4_;
        auVar152._8_4_ = fStack_4d8 + fStack_4b8;
        auVar152._12_4_ = fStack_4d4 + fStack_4b4;
        auVar152._16_4_ = fStack_4d0 + fStack_4b0;
        auVar152._20_4_ = fStack_4cc + fStack_4ac;
        auVar152._24_4_ = fStack_4c8 + fStack_4a8;
        auVar152._28_4_ = fStack_4c4 + fStack_4a4;
        uVar156 = auVar240._0_4_;
        auVar169._4_4_ = uVar156;
        auVar169._0_4_ = uVar156;
        auVar169._8_4_ = uVar156;
        auVar169._12_4_ = uVar156;
        auVar169._16_4_ = uVar156;
        auVar169._20_4_ = uVar156;
        auVar169._24_4_ = uVar156;
        auVar169._28_4_ = uVar156;
        uVar20 = vcmpps_avx512vl(auVar152,auVar169,2);
        auVar153._8_4_ = 2;
        auVar153._0_8_ = 0x200000002;
        auVar153._12_4_ = 2;
        auVar153._16_4_ = 2;
        auVar153._20_4_ = 2;
        auVar153._24_4_ = 2;
        auVar153._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar96 = vpblendmd_avx512vl(auVar153,auVar36);
        local_4c0._0_4_ = (uint)(bVar51 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar51 & 1) * 2;
        bVar61 = (bool)(bVar51 >> 1 & 1);
        local_4c0._4_4_ = (uint)bVar61 * auVar96._4_4_ | (uint)!bVar61 * 2;
        bVar61 = (bool)(bVar51 >> 2 & 1);
        fStack_4b8 = (float)((uint)bVar61 * auVar96._8_4_ | (uint)!bVar61 * 2);
        bVar61 = (bool)(bVar51 >> 3 & 1);
        fStack_4b4 = (float)((uint)bVar61 * auVar96._12_4_ | (uint)!bVar61 * 2);
        bVar61 = (bool)(bVar51 >> 4 & 1);
        fStack_4b0 = (float)((uint)bVar61 * auVar96._16_4_ | (uint)!bVar61 * 2);
        bVar61 = (bool)(bVar51 >> 5 & 1);
        fStack_4ac = (float)((uint)bVar61 * auVar96._20_4_ | (uint)!bVar61 * 2);
        bVar61 = (bool)(bVar51 >> 6 & 1);
        fStack_4a8 = (float)((uint)bVar61 * auVar96._24_4_ | (uint)!bVar61 * 2);
        fStack_4a4 = (float)((uint)(bVar51 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar51 >> 7) * 2);
        bVar50 = (byte)uVar21 & bVar50 & (byte)uVar20;
        uVar20 = vpcmpd_avx512vl(_local_4c0,local_440,2);
        local_500 = _local_2c0;
        local_4a0 = (float)local_4e0._0_4_ + (float)local_2c0._0_4_;
        fStack_49c = (float)local_4e0._4_4_ + (float)local_2c0._4_4_;
        fStack_498 = fStack_4d8 + fStack_2b8;
        fStack_494 = fStack_4d4 + fStack_2b4;
        fStack_490 = fStack_4d0 + fStack_2b0;
        fStack_48c = fStack_4cc + fStack_2ac;
        fStack_488 = fStack_4c8 + fStack_2a8;
        fStack_484 = fStack_4c4 + fStack_2a4;
        auVar273 = ZEXT3264(local_7e0);
        auVar265 = ZEXT3264(local_800);
        auVar255 = ZEXT3264(local_820);
        auVar263 = ZEXT3264(local_840);
        auVar246 = ZEXT3264(local_860);
        auVar252 = ZEXT3264(local_880);
        for (bVar58 = (byte)uVar20 & bVar50; auVar274 = ZEXT3264(auVar170), bVar58 != 0;
            bVar58 = ~bVar51 & bVar58 & (byte)uVar20) {
          auVar154._8_4_ = 0x7f800000;
          auVar154._0_8_ = 0x7f8000007f800000;
          auVar154._12_4_ = 0x7f800000;
          auVar154._16_4_ = 0x7f800000;
          auVar154._20_4_ = 0x7f800000;
          auVar154._24_4_ = 0x7f800000;
          auVar154._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar154,local_500);
          auVar132._0_4_ =
               (uint)(bVar58 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar58 & 1) * 0x7f800000;
          bVar61 = (bool)(bVar58 >> 1 & 1);
          auVar132._4_4_ = (uint)bVar61 * auVar96._4_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar58 >> 2 & 1);
          auVar132._8_4_ = (uint)bVar61 * auVar96._8_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar58 >> 3 & 1);
          auVar132._12_4_ = (uint)bVar61 * auVar96._12_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar58 >> 4 & 1);
          auVar132._16_4_ = (uint)bVar61 * auVar96._16_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar58 >> 5 & 1);
          auVar132._20_4_ = (uint)bVar61 * auVar96._20_4_ | (uint)!bVar61 * 0x7f800000;
          auVar132._24_4_ =
               (uint)(bVar58 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar58 >> 6) * 0x7f800000;
          auVar132._28_4_ = 0x7f800000;
          auVar96 = vshufps_avx(auVar132,auVar132,0xb1);
          auVar96 = vminps_avx(auVar132,auVar96);
          auVar98 = vshufpd_avx(auVar96,auVar96,5);
          auVar96 = vminps_avx(auVar96,auVar98);
          auVar98 = vpermpd_avx2(auVar96,0x4e);
          auVar96 = vminps_avx(auVar96,auVar98);
          uVar20 = vcmpps_avx512vl(auVar132,auVar96,0);
          bVar56 = (byte)uVar20 & bVar58;
          bVar51 = bVar58;
          if (bVar56 != 0) {
            bVar51 = bVar56;
          }
          iVar23 = 0;
          for (uVar65 = (uint)bVar51; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
            iVar23 = iVar23 + 1;
          }
          bVar51 = '\x01' << ((byte)iVar23 & 0x1f);
          uVar65 = *(uint *)(local_200 + (uint)(iVar23 << 2));
          uVar133 = *(uint *)(local_2a0 + (uint)(iVar23 << 2));
          fVar155 = auVar85._0_4_;
          if ((float)local_7c0._0_4_ < 0.0) {
            auVar269 = ZEXT1664(auVar269._0_16_);
            fVar155 = sqrtf((float)local_7c0._0_4_);
            auVar96 = vmovdqa64_avx512vl(auVar90);
            auVar272 = ZEXT3264(auVar96);
            auVar96 = vmovdqa64_avx512vl(auVar89);
            auVar271 = ZEXT3264(auVar96);
            auVar96 = vmovdqa64_avx512vl(auVar88);
            auVar270 = ZEXT3264(auVar96);
            auVar252 = ZEXT3264(local_880);
            auVar246 = ZEXT3264(local_860);
            auVar263 = ZEXT3264(local_840);
            auVar255 = ZEXT3264(local_820);
            auVar265 = ZEXT3264(local_800);
            auVar273 = ZEXT3264(local_7e0);
          }
          uVar64 = (ulong)bVar51;
          auVar79 = vminps_avx(local_620._0_16_,local_660._0_16_);
          auVar86 = vmaxps_avx(local_620._0_16_,local_660._0_16_);
          auVar3 = vminps_avx(local_640._0_16_,local_680._0_16_);
          auVar70 = vminps_avx(auVar79,auVar3);
          auVar79 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
          auVar3 = vmaxps_avx(auVar86,auVar79);
          auVar211._8_4_ = 0x7fffffff;
          auVar211._0_8_ = 0x7fffffff7fffffff;
          auVar211._12_4_ = 0x7fffffff;
          auVar86 = vandps_avx(auVar70,auVar211);
          auVar79 = vandps_avx(auVar3,auVar211);
          auVar86 = vmaxps_avx(auVar86,auVar79);
          auVar79 = vmovshdup_avx(auVar86);
          auVar79 = vmaxss_avx(auVar79,auVar86);
          auVar86 = vshufpd_avx(auVar86,auVar86,1);
          auVar86 = vmaxss_avx(auVar86,auVar79);
          fVar171 = auVar86._0_4_ * 1.9073486e-06;
          local_6e0 = vshufps_avx(auVar3,auVar3,0xff);
          auVar86 = vinsertps_avx(ZEXT416(uVar133),ZEXT416(uVar65),0x10);
          uVar57 = 0;
          while( true ) {
            bVar56 = (byte)uVar64;
            if (uVar57 == 5) break;
            uVar156 = auVar86._0_4_;
            auVar146._4_4_ = uVar156;
            auVar146._0_4_ = uVar156;
            auVar146._8_4_ = uVar156;
            auVar146._12_4_ = uVar156;
            auVar3 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_7b0);
            auVar79 = vmovshdup_avx(auVar86);
            local_5c0._0_16_ = auVar79;
            fVar176 = 1.0 - auVar79._0_4_;
            auVar79 = vshufps_avx(auVar86,auVar86,0x55);
            fVar172 = auVar79._0_4_;
            auVar190._0_4_ = local_660._0_4_ * fVar172;
            fVar173 = auVar79._4_4_;
            auVar190._4_4_ = local_660._4_4_ * fVar173;
            fVar175 = auVar79._8_4_;
            auVar190._8_4_ = local_660._8_4_ * fVar175;
            fVar174 = auVar79._12_4_;
            auVar190._12_4_ = local_660._12_4_ * fVar174;
            _local_5a0 = ZEXT416((uint)fVar176);
            auVar212._4_4_ = fVar176;
            auVar212._0_4_ = fVar176;
            auVar212._8_4_ = fVar176;
            auVar212._12_4_ = fVar176;
            auVar79 = vfmadd231ps_fma(auVar190,auVar212,local_620._0_16_);
            auVar224._0_4_ = local_640._0_4_ * fVar172;
            auVar224._4_4_ = local_640._4_4_ * fVar173;
            auVar224._8_4_ = local_640._8_4_ * fVar175;
            auVar224._12_4_ = local_640._12_4_ * fVar174;
            auVar70 = vfmadd231ps_fma(auVar224,auVar212,local_660._0_16_);
            auVar235._0_4_ = fVar172 * (float)local_680._0_4_;
            auVar235._4_4_ = fVar173 * (float)local_680._4_4_;
            auVar235._8_4_ = fVar175 * fStack_678;
            auVar235._12_4_ = fVar174 * fStack_674;
            auVar76 = vfmadd231ps_fma(auVar235,auVar212,local_640._0_16_);
            auVar244._0_4_ = fVar172 * auVar70._0_4_;
            auVar244._4_4_ = fVar173 * auVar70._4_4_;
            auVar244._8_4_ = fVar175 * auVar70._8_4_;
            auVar244._12_4_ = fVar174 * auVar70._12_4_;
            auVar79 = vfmadd231ps_fma(auVar244,auVar212,auVar79);
            auVar191._0_4_ = fVar172 * auVar76._0_4_;
            auVar191._4_4_ = fVar173 * auVar76._4_4_;
            auVar191._8_4_ = fVar175 * auVar76._8_4_;
            auVar191._12_4_ = fVar174 * auVar76._12_4_;
            auVar70 = vfmadd231ps_fma(auVar191,auVar212,auVar70);
            auVar225._0_4_ = fVar172 * auVar70._0_4_;
            auVar225._4_4_ = fVar173 * auVar70._4_4_;
            auVar225._8_4_ = fVar175 * auVar70._8_4_;
            auVar225._12_4_ = fVar174 * auVar70._12_4_;
            auVar76 = vfmadd231ps_fma(auVar225,auVar79,auVar212);
            auVar79 = vsubps_avx(auVar70,auVar79);
            auVar29._8_4_ = 0x40400000;
            auVar29._0_8_ = 0x4040000040400000;
            auVar29._12_4_ = 0x40400000;
            auVar70 = vmulps_avx512vl(auVar79,auVar29);
            local_580._0_16_ = auVar76;
            auVar3 = vsubps_avx(auVar3,auVar76);
            auVar79 = vdpps_avx(auVar3,auVar3,0x7f);
            fVar172 = auVar79._0_4_;
            local_740 = ZEXT1632(auVar86);
            if (fVar172 < 0.0) {
              auVar255._0_4_ = sqrtf(fVar172);
              auVar255._4_60_ = extraout_var_00;
              auVar86 = auVar255._0_16_;
              uVar64 = extraout_RAX_02;
            }
            else {
              auVar86 = vsqrtss_avx(auVar79,auVar79);
            }
            local_5e0._0_16_ = vdpps_avx(auVar70,auVar70,0x7f);
            fVar175 = local_5e0._0_4_;
            auVar192._4_12_ = ZEXT812(0) << 0x20;
            auVar192._0_4_ = fVar175;
            local_7a0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar192);
            fVar173 = local_7a0._0_4_ * 1.5;
            local_600._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar192);
            auVar30._8_4_ = 0x80000000;
            auVar30._0_8_ = 0x8000000080000000;
            auVar30._12_4_ = 0x80000000;
            auVar72 = vxorps_avx512vl(local_5e0._0_16_,auVar30);
            auVar76 = vfnmadd213ss_fma(local_600._0_16_,local_5e0._0_16_,ZEXT416(0x40000000));
            local_760._0_4_ = auVar76._0_4_;
            local_6a0._0_4_ = auVar86._0_4_;
            if (fVar175 < auVar72._0_4_) {
              local_780._0_4_ = fVar173;
              fVar174 = sqrtf(fVar175);
              auVar86 = ZEXT416((uint)local_6a0._0_4_);
              uVar64 = extraout_RAX_03;
            }
            else {
              auVar76 = vsqrtss_avx(local_5e0._0_16_,local_5e0._0_16_);
              fVar174 = auVar76._0_4_;
              local_780._0_4_ = fVar173;
            }
            fVar173 = local_7a0._0_4_;
            fVar173 = (float)local_780._0_4_ + fVar175 * -0.5 * fVar173 * fVar173 * fVar173;
            local_780._0_4_ = auVar70._0_4_ * fVar173;
            local_780._4_4_ = auVar70._4_4_ * fVar173;
            local_780._8_4_ = auVar70._8_4_ * fVar173;
            local_780._12_4_ = auVar70._12_4_ * fVar173;
            local_7a0._0_16_ = vdpps_avx(auVar3,local_780._0_16_,0x7f);
            auVar72 = vaddss_avx512f(auVar86,ZEXT416(0x3f800000));
            auVar147._0_4_ = local_7a0._0_4_ * local_7a0._0_4_;
            auVar147._4_4_ = local_7a0._4_4_ * local_7a0._4_4_;
            auVar147._8_4_ = local_7a0._8_4_ * local_7a0._8_4_;
            auVar147._12_4_ = local_7a0._12_4_ * local_7a0._12_4_;
            auVar79 = vsubps_avx(auVar79,auVar147);
            fVar175 = auVar79._0_4_;
            auVar164._4_12_ = ZEXT812(0) << 0x20;
            auVar164._0_4_ = fVar175;
            auVar76 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar164);
            auVar73 = vmulss_avx512f(auVar76,ZEXT416(0x3fc00000));
            in_ZMM26 = ZEXT1664(auVar73);
            auVar74 = vmulss_avx512f(auVar79,ZEXT416(0xbf000000));
            uVar63 = fVar175 == 0.0;
            uVar62 = fVar175 < 0.0;
            if ((bool)uVar62) {
              local_6d0 = fVar173;
              fStack_6cc = fVar173;
              fStack_6c8 = fVar173;
              fStack_6c4 = fVar173;
              local_6c0 = auVar76;
              fVar175 = sqrtf(fVar175);
              auVar74 = ZEXT416(auVar74._0_4_);
              in_ZMM26 = ZEXT464(auVar73._0_4_);
              auVar86 = ZEXT416((uint)local_6a0._0_4_);
              auVar72 = ZEXT416(auVar72._0_4_);
              uVar64 = extraout_RAX_04;
              auVar76 = local_6c0;
              fVar173 = local_6d0;
              fVar176 = fStack_6cc;
              fVar177 = fStack_6c8;
              fVar258 = fStack_6c4;
            }
            else {
              auVar79 = vsqrtss_avx(auVar79,auVar79);
              fVar175 = auVar79._0_4_;
              fVar176 = fVar173;
              fVar177 = fVar173;
              fVar258 = fVar173;
            }
            auVar269 = ZEXT1664(auVar3);
            auVar273 = ZEXT3264(local_7e0);
            auVar265 = ZEXT3264(local_800);
            auVar255 = ZEXT3264(local_820);
            auVar263 = ZEXT3264(local_840);
            auVar96 = vmovdqa64_avx512vl(auVar88);
            auVar270 = ZEXT3264(auVar96);
            auVar96 = vmovdqa64_avx512vl(auVar89);
            auVar271 = ZEXT3264(auVar96);
            auVar96 = vmovdqa64_avx512vl(auVar90);
            auVar272 = ZEXT3264(auVar96);
            auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_5a0,local_5c0._0_16_);
            auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5c0._0_16_,_local_5a0);
            fVar179 = auVar79._0_4_ * 6.0;
            fVar178 = local_5c0._0_4_ * 6.0;
            auVar213._0_4_ = fVar178 * (float)local_680._0_4_;
            auVar213._4_4_ = fVar178 * (float)local_680._4_4_;
            auVar213._8_4_ = fVar178 * fStack_678;
            auVar213._12_4_ = fVar178 * fStack_674;
            auVar193._4_4_ = fVar179;
            auVar193._0_4_ = fVar179;
            auVar193._8_4_ = fVar179;
            auVar193._12_4_ = fVar179;
            auVar79 = vfmadd132ps_fma(auVar193,auVar213,local_640._0_16_);
            fVar179 = auVar73._0_4_ * 6.0;
            auVar165._4_4_ = fVar179;
            auVar165._0_4_ = fVar179;
            auVar165._8_4_ = fVar179;
            auVar165._12_4_ = fVar179;
            auVar79 = vfmadd132ps_fma(auVar165,auVar79,local_660._0_16_);
            fVar179 = local_5a0._0_4_ * 6.0;
            auVar194._4_4_ = fVar179;
            auVar194._0_4_ = fVar179;
            auVar194._8_4_ = fVar179;
            auVar194._12_4_ = fVar179;
            auVar79 = vfmadd132ps_fma(auVar194,auVar79,local_620._0_16_);
            auVar166._0_4_ = auVar79._0_4_ * (float)local_5e0._0_4_;
            auVar166._4_4_ = auVar79._4_4_ * (float)local_5e0._0_4_;
            auVar166._8_4_ = auVar79._8_4_ * (float)local_5e0._0_4_;
            auVar166._12_4_ = auVar79._12_4_ * (float)local_5e0._0_4_;
            auVar79 = vdpps_avx(auVar70,auVar79,0x7f);
            fVar179 = auVar79._0_4_;
            auVar195._0_4_ = auVar70._0_4_ * fVar179;
            auVar195._4_4_ = auVar70._4_4_ * fVar179;
            auVar195._8_4_ = auVar70._8_4_ * fVar179;
            auVar195._12_4_ = auVar70._12_4_ * fVar179;
            auVar79 = vsubps_avx(auVar166,auVar195);
            fVar179 = (float)local_760._0_4_ * (float)local_600._0_4_;
            auVar73 = vmaxss_avx(ZEXT416((uint)fVar171),
                                 ZEXT416((uint)(local_740._0_4_ * fVar155 * 1.9073486e-06)));
            auVar31._8_4_ = 0x80000000;
            auVar31._0_8_ = 0x8000000080000000;
            auVar31._12_4_ = 0x80000000;
            auVar77 = vxorps_avx512vl(auVar70,auVar31);
            auVar196._0_4_ = fVar173 * auVar79._0_4_ * fVar179;
            auVar196._4_4_ = fVar176 * auVar79._4_4_ * fVar179;
            auVar196._8_4_ = fVar177 * auVar79._8_4_ * fVar179;
            auVar196._12_4_ = fVar258 * auVar79._12_4_ * fVar179;
            auVar79 = vdpps_avx(auVar77,local_780._0_16_,0x7f);
            auVar75 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar171),auVar73);
            auVar86 = vdpps_avx(auVar3,auVar196,0x7f);
            vfmadd213ss_avx512f(auVar72,ZEXT416((uint)(fVar171 / fVar174)),auVar75);
            fVar173 = auVar79._0_4_ + auVar86._0_4_;
            auVar86 = vdpps_avx(local_7b0,local_780._0_16_,0x7f);
            auVar79 = vdpps_avx(auVar3,auVar77,0x7f);
            auVar72 = vmulss_avx512f(auVar74,auVar76);
            auVar76 = vmulss_avx512f(auVar76,auVar76);
            auVar74 = vaddss_avx512f(in_ZMM26._0_16_,ZEXT416((uint)(auVar72._0_4_ * auVar76._0_4_)))
            ;
            auVar76 = vdpps_avx(auVar3,local_7b0,0x7f);
            auVar75 = vfnmadd231ss_avx512f(auVar79,local_7a0._0_16_,ZEXT416((uint)fVar173));
            auVar76 = vfnmadd231ss_avx512f(auVar76,local_7a0._0_16_,auVar86);
            auVar79 = vpermilps_avx(local_580._0_16_,0xff);
            fVar175 = fVar175 - auVar79._0_4_;
            auVar72 = vshufps_avx(auVar70,auVar70,0xff);
            auVar79 = vfmsub213ss_fma(auVar75,auVar74,auVar72);
            auVar248._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
            auVar248._8_4_ = auVar79._8_4_ ^ 0x80000000;
            auVar248._12_4_ = auVar79._12_4_ ^ 0x80000000;
            auVar76 = ZEXT416((uint)(auVar76._0_4_ * auVar74._0_4_));
            auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar79._0_4_)),
                                      ZEXT416((uint)fVar173),auVar76);
            auVar79 = vinsertps_avx(auVar248,auVar76,0x1c);
            auVar236._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
            auVar236._8_4_ = auVar86._8_4_ ^ 0x80000000;
            auVar236._12_4_ = auVar86._12_4_ ^ 0x80000000;
            auVar76 = vinsertps_avx(ZEXT416((uint)fVar173),auVar236,0x10);
            auVar214._0_4_ = auVar74._0_4_;
            auVar214._4_4_ = auVar214._0_4_;
            auVar214._8_4_ = auVar214._0_4_;
            auVar214._12_4_ = auVar214._0_4_;
            auVar86 = vdivps_avx(auVar79,auVar214);
            auVar79 = vdivps_avx(auVar76,auVar214);
            auVar76 = vbroadcastss_avx512vl(local_7a0._0_16_);
            auVar215._0_4_ = auVar76._0_4_ * auVar86._0_4_ + fVar175 * auVar79._0_4_;
            auVar215._4_4_ = auVar76._4_4_ * auVar86._4_4_ + fVar175 * auVar79._4_4_;
            auVar215._8_4_ = auVar76._8_4_ * auVar86._8_4_ + fVar175 * auVar79._8_4_;
            auVar215._12_4_ = auVar76._12_4_ * auVar86._12_4_ + fVar175 * auVar79._12_4_;
            auVar86 = vsubps_avx(local_740._0_16_,auVar215);
            auVar32._8_4_ = 0x7fffffff;
            auVar32._0_8_ = 0x7fffffff7fffffff;
            auVar32._12_4_ = 0x7fffffff;
            auVar79 = vandps_avx512vl(local_7a0._0_16_,auVar32);
            auVar79 = vucomiss_avx512f(auVar79);
            if (!(bool)uVar62 && !(bool)uVar63) {
              auVar79 = vaddss_avx512f(auVar73,auVar79);
              auVar79 = vfmadd231ss_fma(auVar79,local_6e0,ZEXT416(0x36000000));
              auVar33._8_4_ = 0x7fffffff;
              auVar33._0_8_ = 0x7fffffff7fffffff;
              auVar33._12_4_ = 0x7fffffff;
              auVar76 = vandps_avx512vl(ZEXT416((uint)fVar175),auVar33);
              if (auVar76._0_4_ < auVar79._0_4_) {
                bVar61 = uVar57 < 5;
                fVar155 = auVar86._0_4_ + (float)local_6f0._0_4_;
                auVar246 = ZEXT3264(local_860);
                auVar252 = ZEXT3264(local_880);
                if (fVar155 < fVar2) {
LAB_018a1c08:
                  bVar56 = 0;
                  goto LAB_018a1c10;
                }
                fVar171 = *(float *)(ray + k * 4 + 0x100);
                if (fVar155 <= fVar171) {
                  auVar79 = vmovshdup_avx(auVar86);
                  bVar56 = 0;
                  if ((auVar79._0_4_ < 0.0) || (1.0 < auVar79._0_4_)) goto LAB_018a1c10;
                  auVar216._0_12_ = ZEXT812(0);
                  auVar216._12_4_ = 0;
                  auVar197._4_8_ = auVar216._4_8_;
                  auVar197._0_4_ = fVar172;
                  auVar197._12_4_ = 0;
                  auVar79 = vrsqrt14ss_avx512f(auVar216,auVar197);
                  fVar173 = auVar79._0_4_;
                  pGVar5 = (context->scene->geometries).items[uVar4].ptr;
                  if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_018a1c08;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar56 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_018a1c10;
                  fVar172 = fVar173 * 1.5 + fVar172 * -0.5 * fVar173 * fVar173 * fVar173;
                  auVar198._0_4_ = auVar3._0_4_ * fVar172;
                  auVar198._4_4_ = auVar3._4_4_ * fVar172;
                  auVar198._8_4_ = auVar3._8_4_ * fVar172;
                  auVar198._12_4_ = auVar3._12_4_ * fVar172;
                  auVar72 = vfmadd213ps_fma(auVar72,auVar198,auVar70);
                  auVar79 = vshufps_avx(auVar198,auVar198,0xc9);
                  auVar76 = vshufps_avx(auVar70,auVar70,0xc9);
                  auVar199._0_4_ = auVar198._0_4_ * auVar76._0_4_;
                  auVar199._4_4_ = auVar198._4_4_ * auVar76._4_4_;
                  auVar199._8_4_ = auVar198._8_4_ * auVar76._8_4_;
                  auVar199._12_4_ = auVar198._12_4_ * auVar76._12_4_;
                  auVar76 = vfmsub231ps_fma(auVar199,auVar70,auVar79);
                  auVar79 = vshufps_avx(auVar76,auVar76,0xc9);
                  auVar70 = vshufps_avx(auVar72,auVar72,0xc9);
                  auVar76 = vshufps_avx(auVar76,auVar76,0xd2);
                  auVar148._0_4_ = auVar72._0_4_ * auVar76._0_4_;
                  auVar148._4_4_ = auVar72._4_4_ * auVar76._4_4_;
                  auVar148._8_4_ = auVar72._8_4_ * auVar76._8_4_;
                  auVar148._12_4_ = auVar72._12_4_ * auVar76._12_4_;
                  auVar79 = vfmsub231ps_fma(auVar148,auVar79,auVar70);
                  auVar219._8_4_ = 1;
                  auVar219._0_8_ = 0x100000001;
                  auVar219._12_4_ = 1;
                  auVar219._16_4_ = 1;
                  auVar219._20_4_ = 1;
                  auVar219._24_4_ = 1;
                  auVar219._28_4_ = 1;
                  local_380 = vpermps_avx2(auVar219,ZEXT1632(auVar86));
                  auVar96 = vpermps_avx2(auVar219,ZEXT1632(auVar79));
                  auVar229._8_4_ = 2;
                  auVar229._0_8_ = 0x200000002;
                  auVar229._12_4_ = 2;
                  auVar229._16_4_ = 2;
                  auVar229._20_4_ = 2;
                  auVar229._24_4_ = 2;
                  auVar229._28_4_ = 2;
                  local_3c0 = vpermps_avx2(auVar229,ZEXT1632(auVar79));
                  local_3a0 = auVar79._0_4_;
                  local_3e0[0] = (RTCHitN)auVar96[0];
                  local_3e0[1] = (RTCHitN)auVar96[1];
                  local_3e0[2] = (RTCHitN)auVar96[2];
                  local_3e0[3] = (RTCHitN)auVar96[3];
                  local_3e0[4] = (RTCHitN)auVar96[4];
                  local_3e0[5] = (RTCHitN)auVar96[5];
                  local_3e0[6] = (RTCHitN)auVar96[6];
                  local_3e0[7] = (RTCHitN)auVar96[7];
                  local_3e0[8] = (RTCHitN)auVar96[8];
                  local_3e0[9] = (RTCHitN)auVar96[9];
                  local_3e0[10] = (RTCHitN)auVar96[10];
                  local_3e0[0xb] = (RTCHitN)auVar96[0xb];
                  local_3e0[0xc] = (RTCHitN)auVar96[0xc];
                  local_3e0[0xd] = (RTCHitN)auVar96[0xd];
                  local_3e0[0xe] = (RTCHitN)auVar96[0xe];
                  local_3e0[0xf] = (RTCHitN)auVar96[0xf];
                  local_3e0[0x10] = (RTCHitN)auVar96[0x10];
                  local_3e0[0x11] = (RTCHitN)auVar96[0x11];
                  local_3e0[0x12] = (RTCHitN)auVar96[0x12];
                  local_3e0[0x13] = (RTCHitN)auVar96[0x13];
                  local_3e0[0x14] = (RTCHitN)auVar96[0x14];
                  local_3e0[0x15] = (RTCHitN)auVar96[0x15];
                  local_3e0[0x16] = (RTCHitN)auVar96[0x16];
                  local_3e0[0x17] = (RTCHitN)auVar96[0x17];
                  local_3e0[0x18] = (RTCHitN)auVar96[0x18];
                  local_3e0[0x19] = (RTCHitN)auVar96[0x19];
                  local_3e0[0x1a] = (RTCHitN)auVar96[0x1a];
                  local_3e0[0x1b] = (RTCHitN)auVar96[0x1b];
                  local_3e0[0x1c] = (RTCHitN)auVar96[0x1c];
                  local_3e0[0x1d] = (RTCHitN)auVar96[0x1d];
                  local_3e0[0x1e] = (RTCHitN)auVar96[0x1e];
                  local_3e0[0x1f] = (RTCHitN)auVar96[0x1f];
                  uStack_39c = local_3a0;
                  uStack_398 = local_3a0;
                  uStack_394 = local_3a0;
                  uStack_390 = local_3a0;
                  uStack_38c = local_3a0;
                  uStack_388 = local_3a0;
                  uStack_384 = local_3a0;
                  local_360 = ZEXT432(0) << 0x20;
                  local_340 = local_400._0_8_;
                  uStack_338 = local_400._8_8_;
                  uStack_330 = local_400._16_8_;
                  uStack_328 = local_400._24_8_;
                  local_320 = local_420;
                  vpcmpeqd_avx2(local_420,local_420);
                  local_300 = context->user->instID[0];
                  uStack_2fc = local_300;
                  uStack_2f8 = local_300;
                  uStack_2f4 = local_300;
                  uStack_2f0 = local_300;
                  uStack_2ec = local_300;
                  uStack_2e8 = local_300;
                  uStack_2e4 = local_300;
                  local_2e0 = context->user->instPrimID[0];
                  uStack_2dc = local_2e0;
                  uStack_2d8 = local_2e0;
                  uStack_2d4 = local_2e0;
                  uStack_2d0 = local_2e0;
                  uStack_2cc = local_2e0;
                  uStack_2c8 = local_2e0;
                  uStack_2c4 = local_2e0;
                  *(float *)(ray + k * 4 + 0x100) = fVar155;
                  local_720 = local_460;
                  local_8b0.valid = (int *)local_720;
                  local_8b0.geometryUserPtr = pGVar5->userPtr;
                  local_8b0.context = context->user;
                  local_8b0.hit = local_3e0;
                  local_8b0.N = 8;
                  local_8b0.ray = (RTCRayN *)ray;
                  if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar269 = ZEXT1664(auVar3);
                    (*pGVar5->occlusionFilterN)(&local_8b0);
                    auVar96 = vmovdqa64_avx512vl(auVar90);
                    auVar272 = ZEXT3264(auVar96);
                    auVar96 = vmovdqa64_avx512vl(auVar89);
                    auVar271 = ZEXT3264(auVar96);
                    auVar96 = vmovdqa64_avx512vl(auVar88);
                    auVar270 = ZEXT3264(auVar96);
                    auVar252 = ZEXT3264(local_880);
                    auVar246 = ZEXT3264(local_860);
                    auVar263 = ZEXT3264(local_840);
                    auVar255 = ZEXT3264(local_820);
                    auVar265 = ZEXT3264(local_800);
                    auVar273 = ZEXT3264(local_7e0);
                  }
                  if (local_720 != (undefined1  [32])0x0) {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar269 = ZEXT1664(auVar269._0_16_);
                      (*p_Var9)(&local_8b0);
                      auVar96 = vmovdqa64_avx512vl(auVar90);
                      auVar272 = ZEXT3264(auVar96);
                      auVar96 = vmovdqa64_avx512vl(auVar89);
                      auVar271 = ZEXT3264(auVar96);
                      auVar96 = vmovdqa64_avx512vl(auVar88);
                      auVar270 = ZEXT3264(auVar96);
                      auVar252 = ZEXT3264(local_880);
                      auVar246 = ZEXT3264(local_860);
                      auVar263 = ZEXT3264(local_840);
                      auVar255 = ZEXT3264(local_820);
                      auVar265 = ZEXT3264(local_800);
                      auVar273 = ZEXT3264(local_7e0);
                    }
                    uVar64 = vptestmd_avx512vl(local_720,local_720);
                    auVar96 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar10 = (bool)((byte)uVar64 & 1);
                    bVar11 = (bool)((byte)(uVar64 >> 1) & 1);
                    bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
                    bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
                    bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
                    bVar15 = (bool)((byte)(uVar64 >> 5) & 1);
                    bVar16 = (bool)((byte)(uVar64 >> 6) & 1);
                    bVar17 = SUB81(uVar64 >> 7,0);
                    *(uint *)(local_8b0.ray + 0x100) =
                         (uint)bVar10 * auVar96._0_4_ |
                         (uint)!bVar10 * *(int *)(local_8b0.ray + 0x100);
                    *(uint *)(local_8b0.ray + 0x104) =
                         (uint)bVar11 * auVar96._4_4_ |
                         (uint)!bVar11 * *(int *)(local_8b0.ray + 0x104);
                    *(uint *)(local_8b0.ray + 0x108) =
                         (uint)bVar12 * auVar96._8_4_ |
                         (uint)!bVar12 * *(int *)(local_8b0.ray + 0x108);
                    *(uint *)(local_8b0.ray + 0x10c) =
                         (uint)bVar13 * auVar96._12_4_ |
                         (uint)!bVar13 * *(int *)(local_8b0.ray + 0x10c);
                    *(uint *)(local_8b0.ray + 0x110) =
                         (uint)bVar14 * auVar96._16_4_ |
                         (uint)!bVar14 * *(int *)(local_8b0.ray + 0x110);
                    *(uint *)(local_8b0.ray + 0x114) =
                         (uint)bVar15 * auVar96._20_4_ |
                         (uint)!bVar15 * *(int *)(local_8b0.ray + 0x114);
                    *(uint *)(local_8b0.ray + 0x118) =
                         (uint)bVar16 * auVar96._24_4_ |
                         (uint)!bVar16 * *(int *)(local_8b0.ray + 0x118);
                    *(uint *)(local_8b0.ray + 0x11c) =
                         (uint)bVar17 * auVar96._28_4_ |
                         (uint)!bVar17 * *(int *)(local_8b0.ray + 0x11c);
                    bVar56 = 1;
                    if (local_720 != (undefined1  [32])0x0) goto LAB_018a1c10;
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar171;
                }
                bVar56 = 0;
                goto LAB_018a1c10;
              }
            }
            uVar57 = uVar57 + 1;
            auVar246 = ZEXT3264(local_860);
            auVar252 = ZEXT3264(local_880);
          }
          bVar61 = false;
LAB_018a1c10:
          bVar53 = bVar53 | bVar61 & bVar56;
          uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar239._4_4_ = uVar156;
          auVar239._0_4_ = uVar156;
          auVar239._8_4_ = uVar156;
          auVar239._12_4_ = uVar156;
          auVar239._16_4_ = uVar156;
          auVar239._20_4_ = uVar156;
          auVar239._24_4_ = uVar156;
          auVar239._28_4_ = uVar156;
          auVar240 = ZEXT3264(auVar239);
          auVar49._4_4_ = fStack_49c;
          auVar49._0_4_ = local_4a0;
          auVar49._8_4_ = fStack_498;
          auVar49._12_4_ = fStack_494;
          auVar49._16_4_ = fStack_490;
          auVar49._20_4_ = fStack_48c;
          auVar49._24_4_ = fStack_488;
          auVar49._28_4_ = fStack_484;
          uVar20 = vcmpps_avx512vl(auVar239,auVar49,0xd);
        }
        uVar22 = vpcmpd_avx512vl(local_440,local_280,1);
        uVar21 = vpcmpd_avx512vl(local_440,_local_4c0,1);
        auVar170._0_4_ = (float)local_4e0._0_4_ + (float)local_1c0._0_4_;
        auVar170._4_4_ = (float)local_4e0._4_4_ + (float)local_1c0._4_4_;
        auVar170._8_4_ = fStack_4d8 + fStack_1b8;
        auVar170._12_4_ = fStack_4d4 + fStack_1b4;
        auVar170._16_4_ = fStack_4d0 + fStack_1b0;
        auVar170._20_4_ = fStack_4cc + fStack_1ac;
        auVar170._24_4_ = fStack_4c8 + fStack_1a8;
        auVar170._28_4_ = fStack_4c4 + fStack_1a4;
        uVar156 = auVar240._0_4_;
        auVar202._4_4_ = uVar156;
        auVar202._0_4_ = uVar156;
        auVar202._8_4_ = uVar156;
        auVar202._12_4_ = uVar156;
        auVar202._16_4_ = uVar156;
        auVar202._20_4_ = uVar156;
        auVar202._24_4_ = uVar156;
        auVar202._28_4_ = uVar156;
        uVar20 = vcmpps_avx512vl(auVar170,auVar202,2);
        bVar55 = bVar55 & (byte)uVar22 & (byte)uVar20;
        auVar220._0_4_ = (float)local_4e0._0_4_ + (float)local_2c0._0_4_;
        auVar220._4_4_ = (float)local_4e0._4_4_ + (float)local_2c0._4_4_;
        auVar220._8_4_ = fStack_4d8 + fStack_2b8;
        auVar220._12_4_ = fStack_4d4 + fStack_2b4;
        auVar220._16_4_ = fStack_4d0 + fStack_2b0;
        auVar220._20_4_ = fStack_4cc + fStack_2ac;
        auVar220._24_4_ = fStack_4c8 + fStack_2a8;
        auVar220._28_4_ = fStack_4c4 + fStack_2a4;
        uVar20 = vcmpps_avx512vl(auVar220,auVar202,2);
        bVar50 = bVar50 & (byte)uVar21 & (byte)uVar20 | bVar55;
        if (bVar50 != 0) {
          uVar57 = (ulong)uVar60;
          abStack_180[uVar57 * 0x60] = bVar50;
          bVar61 = (bool)(bVar55 >> 1 & 1);
          bVar10 = (bool)(bVar55 >> 2 & 1);
          bVar11 = (bool)(bVar55 >> 3 & 1);
          bVar12 = (bool)(bVar55 >> 4 & 1);
          bVar13 = (bool)(bVar55 >> 5 & 1);
          auStack_160[uVar57 * 0x18] =
               (uint)(bVar55 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar55 & 1) * local_2c0._0_4_;
          auStack_160[uVar57 * 0x18 + 1] =
               (uint)bVar61 * local_1c0._4_4_ | (uint)!bVar61 * local_2c0._4_4_;
          auStack_160[uVar57 * 0x18 + 2] =
               (uint)bVar10 * (int)fStack_1b8 | (uint)!bVar10 * (int)fStack_2b8;
          auStack_160[uVar57 * 0x18 + 3] =
               (uint)bVar11 * (int)fStack_1b4 | (uint)!bVar11 * (int)fStack_2b4;
          auStack_160[uVar57 * 0x18 + 4] =
               (uint)bVar12 * (int)fStack_1b0 | (uint)!bVar12 * (int)fStack_2b0;
          auStack_160[uVar57 * 0x18 + 5] =
               (uint)bVar13 * (int)fStack_1ac | (uint)!bVar13 * (int)fStack_2ac;
          auStack_160[uVar57 * 0x18 + 6] =
               (uint)(bVar55 >> 6) * (int)fStack_1a8 | (uint)!(bool)(bVar55 >> 6) * (int)fStack_2a8;
          (&fStack_144)[uVar57 * 0x18] = fStack_2a4;
          uVar64 = vmovlps_avx(local_470);
          (&uStack_140)[uVar57 * 0xc] = uVar64;
          aiStack_138[uVar57 * 0x18] = local_ab4 + 1;
          uVar60 = uVar60 + 1;
        }
        auVar240 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
      }
    }
    do {
      uVar133 = uVar60;
      uVar65 = uVar133 - 1;
      if (uVar133 == 0) {
        if (bVar53 != 0) goto LAB_018a21c3;
        uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar34._4_4_ = uVar156;
        auVar34._0_4_ = uVar156;
        auVar34._8_4_ = uVar156;
        auVar34._12_4_ = uVar156;
        uVar20 = vcmpps_avx512vl(local_480,auVar34,2);
        local_6a8 = (ulong)((uint)uVar20 & (uint)local_6a8 - 1 & (uint)local_6a8);
        goto LAB_0189f884;
      }
      uVar64 = (ulong)uVar65;
      auVar96 = *(undefined1 (*) [32])(auStack_160 + uVar64 * 0x18);
      auVar167._0_4_ = auVar96._0_4_ + (float)local_4e0._0_4_;
      auVar167._4_4_ = auVar96._4_4_ + (float)local_4e0._4_4_;
      auVar167._8_4_ = auVar96._8_4_ + fStack_4d8;
      auVar167._12_4_ = auVar96._12_4_ + fStack_4d4;
      auVar167._16_4_ = auVar96._16_4_ + fStack_4d0;
      auVar167._20_4_ = auVar96._20_4_ + fStack_4cc;
      auVar167._24_4_ = auVar96._24_4_ + fStack_4c8;
      auVar167._28_4_ = auVar96._28_4_ + fStack_4c4;
      uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar37._4_4_ = uVar156;
      auVar37._0_4_ = uVar156;
      auVar37._8_4_ = uVar156;
      auVar37._12_4_ = uVar156;
      auVar37._16_4_ = uVar156;
      auVar37._20_4_ = uVar156;
      auVar37._24_4_ = uVar156;
      auVar37._28_4_ = uVar156;
      uVar20 = vcmpps_avx512vl(auVar167,auVar37,2);
      uVar134 = (uint)uVar20 & (uint)abStack_180[uVar64 * 0x60];
      uVar60 = uVar65;
    } while (uVar134 == 0);
    uVar57 = (&uStack_140)[uVar64 * 0xc];
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar57;
    auVar201._8_4_ = 0x7f800000;
    auVar201._0_8_ = 0x7f8000007f800000;
    auVar201._12_4_ = 0x7f800000;
    auVar201._16_4_ = 0x7f800000;
    auVar201._20_4_ = 0x7f800000;
    auVar201._24_4_ = 0x7f800000;
    auVar201._28_4_ = 0x7f800000;
    auVar98 = vblendmps_avx512vl(auVar201,auVar96);
    bVar50 = (byte)uVar134;
    auVar128._0_4_ =
         (uint)(bVar50 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar50 & 1) * (int)auVar96._0_4_;
    bVar61 = (bool)((byte)(uVar134 >> 1) & 1);
    auVar128._4_4_ = (uint)bVar61 * auVar98._4_4_ | (uint)!bVar61 * (int)auVar96._4_4_;
    bVar61 = (bool)((byte)(uVar134 >> 2) & 1);
    auVar128._8_4_ = (uint)bVar61 * auVar98._8_4_ | (uint)!bVar61 * (int)auVar96._8_4_;
    bVar61 = (bool)((byte)(uVar134 >> 3) & 1);
    auVar128._12_4_ = (uint)bVar61 * auVar98._12_4_ | (uint)!bVar61 * (int)auVar96._12_4_;
    bVar61 = (bool)((byte)(uVar134 >> 4) & 1);
    auVar128._16_4_ = (uint)bVar61 * auVar98._16_4_ | (uint)!bVar61 * (int)auVar96._16_4_;
    bVar61 = (bool)((byte)(uVar134 >> 5) & 1);
    auVar128._20_4_ = (uint)bVar61 * auVar98._20_4_ | (uint)!bVar61 * (int)auVar96._20_4_;
    bVar61 = (bool)((byte)(uVar134 >> 6) & 1);
    auVar128._24_4_ = (uint)bVar61 * auVar98._24_4_ | (uint)!bVar61 * (int)auVar96._24_4_;
    auVar128._28_4_ =
         (uVar134 >> 7) * auVar98._28_4_ | (uint)!SUB41(uVar134 >> 7,0) * (int)auVar96._28_4_;
    auVar96 = vshufps_avx(auVar128,auVar128,0xb1);
    auVar96 = vminps_avx(auVar128,auVar96);
    auVar98 = vshufpd_avx(auVar96,auVar96,5);
    auVar96 = vminps_avx(auVar96,auVar98);
    auVar98 = vpermpd_avx2(auVar96,0x4e);
    auVar96 = vminps_avx(auVar96,auVar98);
    uVar20 = vcmpps_avx512vl(auVar128,auVar96,0);
    bVar58 = (byte)uVar20 & bVar50;
    if (bVar58 != 0) {
      uVar134 = (uint)bVar58;
    }
    uVar135 = 0;
    for (; (uVar134 & 1) == 0; uVar134 = uVar134 >> 1 | 0x80000000) {
      uVar135 = uVar135 + 1;
    }
    local_ab4 = aiStack_138[uVar64 * 0x18];
    bVar50 = ~('\x01' << ((byte)uVar135 & 0x1f)) & bVar50;
    abStack_180[uVar64 * 0x60] = bVar50;
    uVar60 = uVar133;
    if (bVar50 == 0) {
      uVar60 = uVar65;
    }
    uVar156 = (undefined4)uVar57;
    auVar149._4_4_ = uVar156;
    auVar149._0_4_ = uVar156;
    auVar149._8_4_ = uVar156;
    auVar149._12_4_ = uVar156;
    auVar149._16_4_ = uVar156;
    auVar149._20_4_ = uVar156;
    auVar149._24_4_ = uVar156;
    auVar149._28_4_ = uVar156;
    auVar86 = vmovshdup_avx(auVar160);
    auVar86 = vsubps_avx(auVar86,auVar160);
    auVar168._0_4_ = auVar86._0_4_;
    auVar168._4_4_ = auVar168._0_4_;
    auVar168._8_4_ = auVar168._0_4_;
    auVar168._12_4_ = auVar168._0_4_;
    auVar168._16_4_ = auVar168._0_4_;
    auVar168._20_4_ = auVar168._0_4_;
    auVar168._24_4_ = auVar168._0_4_;
    auVar168._28_4_ = auVar168._0_4_;
    auVar86 = vfmadd132ps_fma(auVar168,auVar149,_DAT_01f7b040);
    auVar96 = ZEXT1632(auVar86);
    local_3e0[0] = (RTCHitN)auVar96[0];
    local_3e0[1] = (RTCHitN)auVar96[1];
    local_3e0[2] = (RTCHitN)auVar96[2];
    local_3e0[3] = (RTCHitN)auVar96[3];
    local_3e0[4] = (RTCHitN)auVar96[4];
    local_3e0[5] = (RTCHitN)auVar96[5];
    local_3e0[6] = (RTCHitN)auVar96[6];
    local_3e0[7] = (RTCHitN)auVar96[7];
    local_3e0[8] = (RTCHitN)auVar96[8];
    local_3e0[9] = (RTCHitN)auVar96[9];
    local_3e0[10] = (RTCHitN)auVar96[10];
    local_3e0[0xb] = (RTCHitN)auVar96[0xb];
    local_3e0[0xc] = (RTCHitN)auVar96[0xc];
    local_3e0[0xd] = (RTCHitN)auVar96[0xd];
    local_3e0[0xe] = (RTCHitN)auVar96[0xe];
    local_3e0[0xf] = (RTCHitN)auVar96[0xf];
    local_3e0[0x10] = (RTCHitN)auVar96[0x10];
    local_3e0[0x11] = (RTCHitN)auVar96[0x11];
    local_3e0[0x12] = (RTCHitN)auVar96[0x12];
    local_3e0[0x13] = (RTCHitN)auVar96[0x13];
    local_3e0[0x14] = (RTCHitN)auVar96[0x14];
    local_3e0[0x15] = (RTCHitN)auVar96[0x15];
    local_3e0[0x16] = (RTCHitN)auVar96[0x16];
    local_3e0[0x17] = (RTCHitN)auVar96[0x17];
    local_3e0[0x18] = (RTCHitN)auVar96[0x18];
    local_3e0[0x19] = (RTCHitN)auVar96[0x19];
    local_3e0[0x1a] = (RTCHitN)auVar96[0x1a];
    local_3e0[0x1b] = (RTCHitN)auVar96[0x1b];
    local_3e0[0x1c] = (RTCHitN)auVar96[0x1c];
    local_3e0[0x1d] = (RTCHitN)auVar96[0x1d];
    local_3e0[0x1e] = (RTCHitN)auVar96[0x1e];
    local_3e0[0x1f] = (RTCHitN)auVar96[0x1f];
    local_470._8_8_ = 0;
    local_470._0_8_ = *(ulong *)(local_3e0 + (ulong)uVar135 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }